

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  uint uVar82;
  uint uVar83;
  undefined1 (*pauVar84) [32];
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  long lVar89;
  int iVar90;
  ulong uVar91;
  long lVar92;
  float fVar93;
  float fVar95;
  float fVar123;
  float fVar125;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar94;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar127;
  undefined1 auVar113 [32];
  float fVar124;
  float fVar126;
  float fVar128;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar101 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar132;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar160;
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar133;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar159;
  float fVar161;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar167 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar201;
  float fVar202;
  vint4 ai_1;
  undefined1 auVar180 [16];
  float fVar203;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [28];
  float fVar204;
  float fVar205;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar206;
  float fVar207;
  float fVar226;
  float fVar228;
  vint4 ai_2;
  undefined1 auVar208 [16];
  float fVar230;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  float fVar232;
  float fVar233;
  undefined1 auVar220 [32];
  float fVar227;
  float fVar229;
  float fVar231;
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar235;
  float fVar250;
  float fVar252;
  undefined1 auVar237 [16];
  float fVar236;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar243 [32];
  float fVar259;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar277;
  float fVar280;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar283;
  undefined1 auVar269 [32];
  float fVar278;
  float fVar281;
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar270 [32];
  float fVar279;
  float fVar282;
  float fVar285;
  float fVar288;
  float fVar291;
  float fVar294;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar275 [32];
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar268 [32];
  undefined1 auVar276 [64];
  float fVar295;
  float fVar305;
  float fVar307;
  vint4 ai;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar313;
  float fVar316;
  float fVar319;
  undefined1 auVar302 [32];
  float fVar296;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar314;
  float fVar317;
  float fVar320;
  float fVar322;
  undefined1 auVar303 [32];
  float fVar309;
  float fVar312;
  float fVar315;
  float fVar318;
  float fVar321;
  undefined1 auVar304 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar328 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar329 [64];
  undefined1 auVar330 [16];
  float fVar333;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar334;
  float fVar343;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar344;
  float fVar349;
  float fVar350;
  undefined1 auVar345 [16];
  float fVar355;
  undefined1 auVar346 [32];
  float fVar351;
  undefined1 auVar347 [32];
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar348 [64];
  float fVar356;
  float fVar359;
  float fVar360;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar376;
  float fVar377;
  undefined1 auVar368 [16];
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar378;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [64];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 (*local_948) [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  ulong local_8a0;
  undefined1 auStack_898 [24];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  undefined1 auStack_5e0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar11 = prim[1];
  uVar91 = (ulong)(byte)PVar11;
  lVar92 = uVar91 * 0x25;
  fVar132 = *(float *)(prim + lVar92 + 0x12);
  auVar264 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar264 = vinsertps_avx(auVar264,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar264 = vsubps_avx(auVar264,*(undefined1 (*) [16])(prim + lVar92 + 6));
  auVar134._0_4_ = fVar132 * auVar264._0_4_;
  auVar134._4_4_ = fVar132 * auVar264._4_4_;
  auVar134._8_4_ = fVar132 * auVar264._8_4_;
  auVar134._12_4_ = fVar132 * auVar264._12_4_;
  auVar297._0_4_ = fVar132 * auVar19._0_4_;
  auVar297._4_4_ = fVar132 * auVar19._4_4_;
  auVar297._8_4_ = fVar132 * auVar19._8_4_;
  auVar297._12_4_ = fVar132 * auVar19._12_4_;
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar91 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar238 = vcvtdq2ps_avx(auVar238);
  auVar138 = vshufps_avx(auVar297,auVar297,0);
  auVar189 = vshufps_avx(auVar297,auVar297,0x55);
  auVar106 = vshufps_avx(auVar297,auVar297,0xaa);
  fVar132 = auVar106._0_4_;
  fVar259 = auVar106._4_4_;
  fVar94 = auVar106._8_4_;
  fVar95 = auVar106._12_4_;
  fVar206 = auVar189._0_4_;
  fVar226 = auVar189._4_4_;
  fVar228 = auVar189._8_4_;
  fVar230 = auVar189._12_4_;
  fVar179 = auVar138._0_4_;
  fVar201 = auVar138._4_4_;
  fVar202 = auVar138._8_4_;
  fVar203 = auVar138._12_4_;
  auVar357._0_4_ = fVar179 * auVar264._0_4_ + fVar206 * auVar19._0_4_ + fVar132 * auVar30._0_4_;
  auVar357._4_4_ = fVar201 * auVar264._4_4_ + fVar226 * auVar19._4_4_ + fVar259 * auVar30._4_4_;
  auVar357._8_4_ = fVar202 * auVar264._8_4_ + fVar228 * auVar19._8_4_ + fVar94 * auVar30._8_4_;
  auVar357._12_4_ = fVar203 * auVar264._12_4_ + fVar230 * auVar19._12_4_ + fVar95 * auVar30._12_4_;
  auVar368._0_4_ = fVar179 * auVar137._0_4_ + fVar206 * auVar31._0_4_ + auVar32._0_4_ * fVar132;
  auVar368._4_4_ = fVar201 * auVar137._4_4_ + fVar226 * auVar31._4_4_ + auVar32._4_4_ * fVar259;
  auVar368._8_4_ = fVar202 * auVar137._8_4_ + fVar228 * auVar31._8_4_ + auVar32._8_4_ * fVar94;
  auVar368._12_4_ = fVar203 * auVar137._12_4_ + fVar230 * auVar31._12_4_ + auVar32._12_4_ * fVar95;
  auVar298._0_4_ = fVar179 * auVar33._0_4_ + fVar206 * auVar34._0_4_ + auVar238._0_4_ * fVar132;
  auVar298._4_4_ = fVar201 * auVar33._4_4_ + fVar226 * auVar34._4_4_ + auVar238._4_4_ * fVar259;
  auVar298._8_4_ = fVar202 * auVar33._8_4_ + fVar228 * auVar34._8_4_ + auVar238._8_4_ * fVar94;
  auVar298._12_4_ = fVar203 * auVar33._12_4_ + fVar230 * auVar34._12_4_ + auVar238._12_4_ * fVar95;
  auVar138 = vshufps_avx(auVar134,auVar134,0);
  auVar189 = vshufps_avx(auVar134,auVar134,0x55);
  auVar106 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar132 = auVar106._0_4_;
  fVar259 = auVar106._4_4_;
  fVar94 = auVar106._8_4_;
  fVar95 = auVar106._12_4_;
  fVar206 = auVar189._0_4_;
  fVar226 = auVar189._4_4_;
  fVar228 = auVar189._8_4_;
  fVar230 = auVar189._12_4_;
  fVar179 = auVar138._0_4_;
  fVar201 = auVar138._4_4_;
  fVar202 = auVar138._8_4_;
  fVar203 = auVar138._12_4_;
  auVar135._0_4_ = fVar179 * auVar264._0_4_ + fVar206 * auVar19._0_4_ + fVar132 * auVar30._0_4_;
  auVar135._4_4_ = fVar201 * auVar264._4_4_ + fVar226 * auVar19._4_4_ + fVar259 * auVar30._4_4_;
  auVar135._8_4_ = fVar202 * auVar264._8_4_ + fVar228 * auVar19._8_4_ + fVar94 * auVar30._8_4_;
  auVar135._12_4_ = fVar203 * auVar264._12_4_ + fVar230 * auVar19._12_4_ + fVar95 * auVar30._12_4_;
  auVar96._0_4_ = fVar179 * auVar137._0_4_ + auVar32._0_4_ * fVar132 + fVar206 * auVar31._0_4_;
  auVar96._4_4_ = fVar201 * auVar137._4_4_ + auVar32._4_4_ * fVar259 + fVar226 * auVar31._4_4_;
  auVar96._8_4_ = fVar202 * auVar137._8_4_ + auVar32._8_4_ * fVar94 + fVar228 * auVar31._8_4_;
  auVar96._12_4_ = fVar203 * auVar137._12_4_ + auVar32._12_4_ * fVar95 + fVar230 * auVar31._12_4_;
  auVar323._8_4_ = 0x7fffffff;
  auVar323._0_8_ = 0x7fffffff7fffffff;
  auVar323._12_4_ = 0x7fffffff;
  auVar264 = vandps_avx(auVar357,auVar323);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar264 = vcmpps_avx(auVar264,auVar208,1);
  auVar19 = vblendvps_avx(auVar357,auVar208,auVar264);
  auVar264 = vandps_avx(auVar368,auVar323);
  auVar264 = vcmpps_avx(auVar264,auVar208,1);
  auVar30 = vblendvps_avx(auVar368,auVar208,auVar264);
  auVar264 = vandps_avx(auVar323,auVar298);
  auVar264 = vcmpps_avx(auVar264,auVar208,1);
  auVar264 = vblendvps_avx(auVar298,auVar208,auVar264);
  auVar162._0_4_ = fVar179 * auVar33._0_4_ + fVar206 * auVar34._0_4_ + auVar238._0_4_ * fVar132;
  auVar162._4_4_ = fVar201 * auVar33._4_4_ + fVar226 * auVar34._4_4_ + auVar238._4_4_ * fVar259;
  auVar162._8_4_ = fVar202 * auVar33._8_4_ + fVar228 * auVar34._8_4_ + auVar238._8_4_ * fVar94;
  auVar162._12_4_ = fVar203 * auVar33._12_4_ + fVar230 * auVar34._12_4_ + auVar238._12_4_ * fVar95;
  auVar137 = vrcpps_avx(auVar19);
  fVar179 = auVar137._0_4_;
  auVar180._0_4_ = fVar179 * auVar19._0_4_;
  fVar201 = auVar137._4_4_;
  auVar180._4_4_ = fVar201 * auVar19._4_4_;
  fVar202 = auVar137._8_4_;
  auVar180._8_4_ = fVar202 * auVar19._8_4_;
  fVar203 = auVar137._12_4_;
  auVar180._12_4_ = fVar203 * auVar19._12_4_;
  auVar263._8_4_ = 0x3f800000;
  auVar263._0_8_ = 0x3f8000003f800000;
  auVar263._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar263,auVar180);
  fVar179 = fVar179 + fVar179 * auVar19._0_4_;
  fVar201 = fVar201 + fVar201 * auVar19._4_4_;
  fVar202 = fVar202 + fVar202 * auVar19._8_4_;
  fVar203 = fVar203 + fVar203 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar30);
  fVar206 = auVar19._0_4_;
  auVar237._0_4_ = fVar206 * auVar30._0_4_;
  fVar226 = auVar19._4_4_;
  auVar237._4_4_ = fVar226 * auVar30._4_4_;
  fVar228 = auVar19._8_4_;
  auVar237._8_4_ = fVar228 * auVar30._8_4_;
  fVar230 = auVar19._12_4_;
  auVar237._12_4_ = fVar230 * auVar30._12_4_;
  auVar19 = vsubps_avx(auVar263,auVar237);
  fVar206 = fVar206 + fVar206 * auVar19._0_4_;
  fVar226 = fVar226 + fVar226 * auVar19._4_4_;
  fVar228 = fVar228 + fVar228 * auVar19._8_4_;
  fVar230 = fVar230 + fVar230 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar264);
  fVar235 = auVar19._0_4_;
  auVar299._0_4_ = fVar235 * auVar264._0_4_;
  fVar250 = auVar19._4_4_;
  auVar299._4_4_ = fVar250 * auVar264._4_4_;
  fVar252 = auVar19._8_4_;
  auVar299._8_4_ = fVar252 * auVar264._8_4_;
  fVar254 = auVar19._12_4_;
  auVar299._12_4_ = fVar254 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar263,auVar299);
  fVar235 = fVar235 + fVar235 * auVar264._0_4_;
  fVar250 = fVar250 + fVar250 * auVar264._4_4_;
  fVar252 = fVar252 + fVar252 * auVar264._8_4_;
  fVar254 = fVar254 + fVar254 * auVar264._12_4_;
  auVar264 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar92 + 0x16)) *
                           *(float *)(prim + lVar92 + 0x1a)));
  auVar30 = vshufps_avx(auVar264,auVar264,0);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar264 = vpmovsxwd_avx(auVar264);
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar137 = vsubps_avx(auVar19,auVar264);
  fVar132 = auVar30._0_4_;
  fVar259 = auVar30._4_4_;
  fVar94 = auVar30._8_4_;
  fVar95 = auVar30._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar30);
  auVar300._0_4_ = auVar137._0_4_ * fVar132 + auVar264._0_4_;
  auVar300._4_4_ = auVar137._4_4_ * fVar259 + auVar264._4_4_;
  auVar300._8_4_ = auVar137._8_4_ * fVar94 + auVar264._8_4_;
  auVar300._12_4_ = auVar137._12_4_ * fVar95 + auVar264._12_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar30 = vpmovsxwd_avx(auVar137);
  auVar264 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar30);
  auVar19 = vsubps_avx(auVar19,auVar264);
  auVar324._0_4_ = auVar19._0_4_ * fVar132 + auVar264._0_4_;
  auVar324._4_4_ = auVar19._4_4_ * fVar259 + auVar264._4_4_;
  auVar324._8_4_ = auVar19._8_4_ * fVar94 + auVar264._8_4_;
  auVar324._12_4_ = auVar19._12_4_ * fVar95 + auVar264._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar264 = vpmovsxwd_avx(auVar31);
  uVar85 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar91 * 2 + uVar85 + 6);
  auVar19 = vpmovsxwd_avx(auVar32);
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar264);
  auVar330._0_4_ = auVar19._0_4_ * fVar132 + auVar264._0_4_;
  auVar330._4_4_ = auVar19._4_4_ * fVar259 + auVar264._4_4_;
  auVar330._8_4_ = auVar19._8_4_ * fVar94 + auVar264._8_4_;
  auVar330._12_4_ = auVar19._12_4_ * fVar95 + auVar264._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar264 = vpmovsxwd_avx(auVar33);
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar34);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar30 = vsubps_avx(auVar19,auVar264);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar238);
  auVar335._0_4_ = auVar30._0_4_ * fVar132 + auVar264._0_4_;
  auVar335._4_4_ = auVar30._4_4_ * fVar259 + auVar264._4_4_;
  auVar335._8_4_ = auVar30._8_4_ * fVar94 + auVar264._8_4_;
  auVar335._12_4_ = auVar30._12_4_ * fVar95 + auVar264._12_4_;
  auVar264 = vcvtdq2ps_avx(auVar19);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar91 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar19 = vpmovsxwd_avx(auVar138);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar264);
  auVar345._0_4_ = auVar19._0_4_ * fVar132 + auVar264._0_4_;
  auVar345._4_4_ = auVar19._4_4_ * fVar259 + auVar264._4_4_;
  auVar345._8_4_ = auVar19._8_4_ * fVar94 + auVar264._8_4_;
  auVar345._12_4_ = auVar19._12_4_ * fVar95 + auVar264._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar91) + 6);
  auVar264 = vpmovsxwd_avx(auVar189);
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar106);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar264);
  auVar265._0_4_ = auVar264._0_4_ + auVar19._0_4_ * fVar132;
  auVar265._4_4_ = auVar264._4_4_ + auVar19._4_4_ * fVar259;
  auVar265._8_4_ = auVar264._8_4_ + auVar19._8_4_ * fVar94;
  auVar265._12_4_ = auVar264._12_4_ + auVar19._12_4_ * fVar95;
  auVar264 = vsubps_avx(auVar300,auVar135);
  auVar301._0_4_ = fVar179 * auVar264._0_4_;
  auVar301._4_4_ = fVar201 * auVar264._4_4_;
  auVar301._8_4_ = fVar202 * auVar264._8_4_;
  auVar301._12_4_ = fVar203 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar324,auVar135);
  auVar108._0_4_ = fVar179 * auVar264._0_4_;
  auVar108._4_4_ = fVar201 * auVar264._4_4_;
  auVar108._8_4_ = fVar202 * auVar264._8_4_;
  auVar108._12_4_ = fVar203 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar330,auVar96);
  auVar181._0_4_ = fVar206 * auVar264._0_4_;
  auVar181._4_4_ = fVar226 * auVar264._4_4_;
  auVar181._8_4_ = fVar228 * auVar264._8_4_;
  auVar181._12_4_ = fVar230 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar335,auVar96);
  auVar97._0_4_ = fVar206 * auVar264._0_4_;
  auVar97._4_4_ = fVar226 * auVar264._4_4_;
  auVar97._8_4_ = fVar228 * auVar264._8_4_;
  auVar97._12_4_ = fVar230 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar345,auVar162);
  auVar209._0_4_ = fVar235 * auVar264._0_4_;
  auVar209._4_4_ = fVar250 * auVar264._4_4_;
  auVar209._8_4_ = fVar252 * auVar264._8_4_;
  auVar209._12_4_ = fVar254 * auVar264._12_4_;
  auVar264 = vsubps_avx(auVar265,auVar162);
  auVar163._0_4_ = fVar235 * auVar264._0_4_;
  auVar163._4_4_ = fVar250 * auVar264._4_4_;
  auVar163._8_4_ = fVar252 * auVar264._8_4_;
  auVar163._12_4_ = fVar254 * auVar264._12_4_;
  auVar264 = vpminsd_avx(auVar301,auVar108);
  auVar19 = vpminsd_avx(auVar181,auVar97);
  auVar264 = vmaxps_avx(auVar264,auVar19);
  auVar19 = vpminsd_avx(auVar209,auVar163);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar325._4_4_ = uVar9;
  auVar325._0_4_ = uVar9;
  auVar325._8_4_ = uVar9;
  auVar325._12_4_ = uVar9;
  auVar19 = vmaxps_avx(auVar19,auVar325);
  auVar264 = vmaxps_avx(auVar264,auVar19);
  local_480._0_4_ = auVar264._0_4_ * 0.99999964;
  local_480._4_4_ = auVar264._4_4_ * 0.99999964;
  local_480._8_4_ = auVar264._8_4_ * 0.99999964;
  local_480._12_4_ = auVar264._12_4_ * 0.99999964;
  auVar264 = vpmaxsd_avx(auVar301,auVar108);
  auVar19 = vpmaxsd_avx(auVar181,auVar97);
  auVar264 = vminps_avx(auVar264,auVar19);
  auVar19 = vpmaxsd_avx(auVar209,auVar163);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar164._4_4_ = uVar9;
  auVar164._0_4_ = uVar9;
  auVar164._8_4_ = uVar9;
  auVar164._12_4_ = uVar9;
  auVar19 = vminps_avx(auVar19,auVar164);
  auVar264 = vminps_avx(auVar264,auVar19);
  auVar98._0_4_ = auVar264._0_4_ * 1.0000004;
  auVar98._4_4_ = auVar264._4_4_ * 1.0000004;
  auVar98._8_4_ = auVar264._8_4_ * 1.0000004;
  auVar98._12_4_ = auVar264._12_4_ * 1.0000004;
  auVar264 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar19 = vpcmpgtd_avx(auVar264,_DAT_01f7fcf0);
  auVar264 = vcmpps_avx(local_480,auVar98,2);
  auVar264 = vandps_avx(auVar264,auVar19);
  uVar82 = vmovmskps_avx(auVar264);
  if (uVar82 == 0) {
    return;
  }
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  uVar82 = uVar82 & 0xff;
  local_3e0 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_948 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7e8 = prim;
LAB_00f65324:
  lVar92 = 0;
  if (uVar82 != 0) {
    for (; (uVar82 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  uVar88 = *(uint *)(local_7e8 + 2);
  local_8a0 = (ulong)*(uint *)(local_7e8 + lVar92 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar88].ptr;
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_8a0 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar132 = (pGVar12->time_range).lower;
  fVar132 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar132) / ((pGVar12->time_range).upper - fVar132));
  auVar264 = vroundss_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),9);
  auVar264 = vminss_avx(auVar264,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar264 = vmaxss_avx(ZEXT816(0) << 0x20,auVar264);
  fVar132 = fVar132 - auVar264._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar264._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar89);
  lVar15 = *(long *)(_Var13 + 0x38 + lVar89);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar89);
  auVar264 = vshufps_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),0);
  pfVar2 = (float *)(lVar15 + lVar16 * uVar91);
  fVar203 = auVar264._0_4_;
  fVar206 = auVar264._4_4_;
  fVar226 = auVar264._8_4_;
  fVar228 = auVar264._12_4_;
  lVar1 = uVar91 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  p_Var17 = pGVar12[4].occlusionFilterN;
  auVar264 = vshufps_avx(ZEXT416((uint)(1.0 - fVar132)),ZEXT416((uint)(1.0 - fVar132)),0);
  pfVar4 = (float *)(*(long *)(_Var13 + lVar89) + lVar14 * uVar91);
  fVar95 = auVar264._0_4_;
  fVar179 = auVar264._4_4_;
  fVar201 = auVar264._8_4_;
  fVar202 = auVar264._12_4_;
  pfVar5 = (float *)(*(long *)(_Var13 + lVar89) + lVar14 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var17 + lVar89 + 0x38) +
                    uVar91 * *(long *)(p_Var17 + lVar89 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var17 + lVar89 + 0x38) + *(long *)(p_Var17 + lVar89 + 0x48) * lVar1
                    );
  pfVar8 = (float *)(*(long *)(p_Var17 + lVar89) + *(long *)(p_Var17 + lVar89 + 0x10) * uVar91);
  auVar136._0_4_ = fVar95 * *pfVar4 + fVar203 * *pfVar2;
  auVar136._4_4_ = fVar179 * pfVar4[1] + fVar206 * pfVar2[1];
  auVar136._8_4_ = fVar201 * pfVar4[2] + fVar226 * pfVar2[2];
  auVar136._12_4_ = fVar202 * pfVar4[3] + fVar228 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var17 + lVar89) + *(long *)(p_Var17 + lVar89 + 0x10) * lVar1);
  auVar165._0_4_ = fVar95 * *pfVar5 + fVar203 * *pfVar3;
  auVar165._4_4_ = fVar179 * pfVar5[1] + fVar206 * pfVar3[1];
  auVar165._8_4_ = fVar201 * pfVar5[2] + fVar226 * pfVar3[2];
  auVar165._12_4_ = fVar202 * pfVar5[3] + fVar228 * pfVar3[3];
  auVar264 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar19 = vinsertps_avx(auVar264,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar132 = *(float *)(ray + k * 4 + 0x40);
  auVar336._4_4_ = fVar132;
  auVar336._0_4_ = fVar132;
  auVar336._8_4_ = fVar132;
  auVar336._12_4_ = fVar132;
  fStack_730 = fVar132;
  _local_740 = auVar336;
  fStack_72c = fVar132;
  fStack_728 = fVar132;
  fStack_724 = fVar132;
  fVar259 = *(float *)(ray + k * 4 + 0x50);
  auVar358._4_4_ = fVar259;
  auVar358._0_4_ = fVar259;
  auVar358._8_4_ = fVar259;
  auVar358._12_4_ = fVar259;
  fStack_750 = fVar259;
  _local_760 = auVar358;
  fStack_74c = fVar259;
  fStack_748 = fVar259;
  fStack_744 = fVar259;
  auVar264 = vunpcklps_avx(auVar336,auVar358);
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  auVar382._4_4_ = fVar94;
  auVar382._0_4_ = fVar94;
  auVar382._8_4_ = fVar94;
  auVar382._12_4_ = fVar94;
  fStack_710 = fVar94;
  _local_720 = auVar382;
  fStack_70c = fVar94;
  fStack_708 = fVar94;
  register0x0000159c = fVar94;
  _local_8f0 = vinsertps_avx(auVar264,auVar382,0x28);
  auVar210._0_4_ = auVar136._0_4_ + (fVar95 * *pfVar8 + fVar203 * *pfVar6) * 0.33333334;
  auVar210._4_4_ = auVar136._4_4_ + (fVar179 * pfVar8[1] + fVar206 * pfVar6[1]) * 0.33333334;
  auVar210._8_4_ = auVar136._8_4_ + (fVar201 * pfVar8[2] + fVar226 * pfVar6[2]) * 0.33333334;
  auVar210._12_4_ = auVar136._12_4_ + (fVar202 * pfVar8[3] + fVar228 * pfVar6[3]) * 0.33333334;
  auVar99._0_4_ = (fVar95 * *pfVar2 + fVar203 * *pfVar7) * 0.33333334;
  auVar99._4_4_ = (fVar179 * pfVar2[1] + fVar206 * pfVar7[1]) * 0.33333334;
  auVar99._8_4_ = (fVar201 * pfVar2[2] + fVar226 * pfVar7[2]) * 0.33333334;
  auVar99._12_4_ = (fVar202 * pfVar2[3] + fVar228 * pfVar7[3]) * 0.33333334;
  auVar137 = vsubps_avx(auVar165,auVar99);
  auVar100._0_4_ = (auVar165._0_4_ + auVar136._0_4_ + auVar210._0_4_ + auVar137._0_4_) * 0.25;
  auVar100._4_4_ = (auVar165._4_4_ + auVar136._4_4_ + auVar210._4_4_ + auVar137._4_4_) * 0.25;
  auVar100._8_4_ = (auVar165._8_4_ + auVar136._8_4_ + auVar210._8_4_ + auVar137._8_4_) * 0.25;
  auVar100._12_4_ = (auVar165._12_4_ + auVar136._12_4_ + auVar210._12_4_ + auVar137._12_4_) * 0.25;
  auVar264 = vsubps_avx(auVar100,auVar19);
  auVar264 = vdpps_avx(auVar264,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar30 = vrcpss_avx(local_900,local_900);
  fVar95 = auVar264._0_4_ * auVar30._0_4_ * (2.0 - local_900._0_4_ * auVar30._0_4_);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),0);
  auVar182._0_4_ = auVar19._0_4_ + local_8f0._0_4_ * auVar30._0_4_;
  auVar182._4_4_ = auVar19._4_4_ + local_8f0._4_4_ * auVar30._4_4_;
  auVar182._8_4_ = auVar19._8_4_ + local_8f0._8_4_ * auVar30._8_4_;
  auVar182._12_4_ = auVar19._12_4_ + local_8f0._12_4_ * auVar30._12_4_;
  auVar264 = vblendps_avx(auVar182,_DAT_01f7aa10,8);
  auVar31 = vsubps_avx(auVar136,auVar264);
  auVar32 = vsubps_avx(auVar137,auVar264);
  auVar33 = vsubps_avx(auVar210,auVar264);
  auVar34 = vsubps_avx(auVar165,auVar264);
  auVar264 = vshufps_avx(auVar31,auVar31,0);
  auVar19 = vshufps_avx(auVar31,auVar31,0x55);
  local_9c0._16_16_ = auVar19;
  local_9c0._0_16_ = auVar19;
  auVar329 = ZEXT3264(local_9c0);
  auVar19 = vshufps_avx(auVar31,auVar31,0xaa);
  local_980._16_16_ = auVar19;
  local_980._0_16_ = auVar19;
  auVar348 = ZEXT3264(local_980);
  auVar19 = vshufps_avx(auVar31,auVar31,0xff);
  auVar137 = vshufps_avx(auVar33,auVar33,0);
  auVar268._16_16_ = auVar137;
  auVar268._0_16_ = auVar137;
  auVar137 = vshufps_avx(auVar33,auVar33,0x55);
  local_940._16_16_ = auVar137;
  local_940._0_16_ = auVar137;
  auVar388 = ZEXT3264(local_940);
  auVar137 = vshufps_avx(auVar33,auVar33,0xaa);
  local_a20._16_16_ = auVar137;
  local_a20._0_16_ = auVar137;
  auVar391 = ZEXT3264(local_a20);
  auVar137 = vshufps_avx(auVar33,auVar33,0xff);
  local_9a0._16_16_ = auVar137;
  local_9a0._0_16_ = auVar137;
  auVar137 = vshufps_avx(auVar32,auVar32,0);
  local_2c0._16_16_ = auVar137;
  local_2c0._0_16_ = auVar137;
  auVar137 = vshufps_avx(auVar32,auVar32,0x55);
  local_2e0._16_16_ = auVar137;
  local_2e0._0_16_ = auVar137;
  auVar137 = vshufps_avx(auVar32,auVar32,0xaa);
  register0x00001290 = auVar137;
  _local_1e0 = auVar137;
  auVar137 = vshufps_avx(auVar32,auVar32,0xff);
  auVar276 = ZEXT3264(local_9a0);
  register0x00001290 = auVar137;
  _local_200 = auVar137;
  auVar137 = vshufps_avx(auVar34,auVar34,0);
  register0x00001290 = auVar137;
  _local_220 = auVar137;
  auVar137 = vshufps_avx(auVar34,auVar34,0x55);
  register0x00001290 = auVar137;
  _local_240 = auVar137;
  auVar137 = vshufps_avx(auVar34,auVar34,0xaa);
  register0x00001290 = auVar137;
  _local_260 = auVar137;
  auVar137 = vshufps_avx(auVar34,auVar34,0xff);
  register0x00001290 = auVar137;
  _local_280 = auVar137;
  auVar137 = ZEXT416((uint)(fVar132 * fVar132 + fVar259 * fVar259 + fVar94 * fVar94));
  auVar137 = vshufps_avx(auVar137,auVar137,0);
  local_2a0._16_16_ = auVar137;
  local_2a0._0_16_ = auVar137;
  fVar132 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar95);
  auVar137 = vshufps_avx(ZEXT416((uint)(fVar132 - fVar95)),ZEXT416((uint)(fVar132 - fVar95)),0);
  local_300._16_16_ = auVar137;
  local_300._0_16_ = auVar137;
  local_670 = vpshufd_avx(ZEXT416(uVar88),0);
  local_680 = vpshufd_avx(ZEXT416(*(uint *)(local_7e8 + lVar92 * 4 + 6)),0);
  local_c00 = auVar30._0_8_;
  uStack_bf8 = auVar30._8_8_;
  local_880 = local_c00;
  uStack_878 = uStack_bf8;
  uStack_870 = local_c00;
  uStack_868 = uStack_bf8;
  uVar91 = 0;
  local_c08 = 1;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_2a0,auVar112);
  auVar30 = vsqrtss_avx(local_900,local_900);
  auVar137 = vsqrtss_avx(local_900,local_900);
  local_470 = ZEXT816(0x3f80000000000000);
  local_400 = auVar268;
  do {
    auVar220._8_4_ = 0x3f800000;
    auVar220._0_8_ = 0x3f8000003f800000;
    auVar220._12_4_ = 0x3f800000;
    auVar220._16_4_ = 0x3f800000;
    auVar220._20_4_ = 0x3f800000;
    iVar90 = (int)uVar91;
    auVar220._24_4_ = 0x3f800000;
    auVar220._28_4_ = 0x3f800000;
    auVar238 = vmovshdup_avx(local_470);
    auVar189 = vsubps_avx(auVar238,local_470);
    auVar238 = vshufps_avx(local_470,local_470,0);
    local_6c0._16_16_ = auVar238;
    local_6c0._0_16_ = auVar238;
    auVar138 = vshufps_avx(auVar189,auVar189,0);
    local_6e0._16_16_ = auVar138;
    local_6e0._0_16_ = auVar138;
    fVar133 = auVar138._0_4_;
    fVar159 = auVar138._4_4_;
    fVar160 = auVar138._8_4_;
    fVar161 = auVar138._12_4_;
    fVar93 = auVar238._0_4_;
    auVar151._0_4_ = fVar93 + fVar133 * 0.0;
    fVar123 = auVar238._4_4_;
    auVar151._4_4_ = fVar123 + fVar159 * 0.14285715;
    fVar125 = auVar238._8_4_;
    auVar151._8_4_ = fVar125 + fVar160 * 0.2857143;
    fVar127 = auVar238._12_4_;
    auVar151._12_4_ = fVar127 + fVar161 * 0.42857146;
    auVar151._16_4_ = fVar93 + fVar133 * 0.5714286;
    auVar151._20_4_ = fVar123 + fVar159 * 0.71428573;
    auVar151._24_4_ = fVar125 + fVar160 * 0.8571429;
    auVar151._28_4_ = fVar127 + fVar161;
    auVar111 = vsubps_avx(auVar220,auVar151);
    fVar206 = auVar268._28_4_;
    fVar259 = auVar111._0_4_;
    fVar94 = auVar111._4_4_;
    fVar95 = auVar111._8_4_;
    fVar179 = auVar111._12_4_;
    fVar201 = auVar111._16_4_;
    fVar202 = auVar111._20_4_;
    fVar203 = auVar111._24_4_;
    fVar361 = auVar19._12_4_;
    fVar205 = auVar276._28_4_ + fVar206 + auVar264._12_4_ + 1.0 + 1.0;
    fVar260 = local_2c0._0_4_ * auVar151._0_4_ + auVar268._0_4_ * fVar259;
    fVar277 = local_2c0._4_4_ * auVar151._4_4_ + auVar268._4_4_ * fVar94;
    fVar280 = local_2c0._8_4_ * auVar151._8_4_ + auVar268._8_4_ * fVar95;
    fVar283 = local_2c0._12_4_ * auVar151._12_4_ + auVar268._12_4_ * fVar179;
    fVar286 = local_2c0._16_4_ * auVar151._16_4_ + auVar268._16_4_ * fVar201;
    fVar289 = local_2c0._20_4_ * auVar151._20_4_ + auVar268._20_4_ * fVar202;
    fVar292 = local_2c0._24_4_ * auVar151._24_4_ + auVar268._24_4_ * fVar203;
    fVar228 = local_2e0._0_4_ * auVar151._0_4_ + auVar388._0_4_ * fVar259;
    fVar230 = local_2e0._4_4_ * auVar151._4_4_ + auVar388._4_4_ * fVar94;
    fVar235 = local_2e0._8_4_ * auVar151._8_4_ + auVar388._8_4_ * fVar95;
    fVar250 = local_2e0._12_4_ * auVar151._12_4_ + auVar388._12_4_ * fVar179;
    fVar252 = local_2e0._16_4_ * auVar151._16_4_ + auVar388._16_4_ * fVar201;
    fVar254 = local_2e0._20_4_ * auVar151._20_4_ + auVar388._20_4_ * fVar202;
    fVar204 = local_2e0._24_4_ * auVar151._24_4_ + auVar388._24_4_ * fVar203;
    fVar207 = (float)local_1e0._0_4_ * auVar151._0_4_ + auVar391._0_4_ * fVar259;
    fVar227 = (float)local_1e0._4_4_ * auVar151._4_4_ + auVar391._4_4_ * fVar94;
    fVar229 = fStack_1d8 * auVar151._8_4_ + auVar391._8_4_ * fVar95;
    fVar231 = fStack_1d4 * auVar151._12_4_ + auVar391._12_4_ * fVar179;
    fVar232 = fStack_1d0 * auVar151._16_4_ + auVar391._16_4_ * fVar201;
    fVar233 = fStack_1cc * auVar151._20_4_ + auVar391._20_4_ * fVar202;
    fVar234 = fStack_1c8 * auVar151._24_4_ + auVar391._24_4_ * fVar203;
    fVar236 = (float)local_200._0_4_ * auVar151._0_4_ + auVar276._0_4_ * fVar259;
    fVar251 = (float)local_200._4_4_ * auVar151._4_4_ + auVar276._4_4_ * fVar94;
    fVar253 = fStack_1f8 * auVar151._8_4_ + auVar276._8_4_ * fVar95;
    fVar255 = fStack_1f4 * auVar151._12_4_ + auVar276._12_4_ * fVar179;
    fVar256 = fStack_1f0 * auVar151._16_4_ + auVar276._16_4_ * fVar201;
    fVar257 = fStack_1ec * auVar151._20_4_ + auVar276._20_4_ * fVar202;
    fVar258 = fStack_1e8 * auVar151._24_4_ + auVar276._24_4_ * fVar203;
    fVar355 = auVar348._28_4_;
    fVar366 = fVar361 + fVar355;
    auVar331._0_4_ =
         fVar259 * (auVar268._0_4_ * auVar151._0_4_ + auVar264._0_4_ * fVar259) +
         auVar151._0_4_ * fVar260;
    auVar331._4_4_ =
         fVar94 * (auVar268._4_4_ * auVar151._4_4_ + auVar264._4_4_ * fVar94) +
         auVar151._4_4_ * fVar277;
    auVar331._8_4_ =
         fVar95 * (auVar268._8_4_ * auVar151._8_4_ + auVar264._8_4_ * fVar95) +
         auVar151._8_4_ * fVar280;
    auVar331._12_4_ =
         fVar179 * (auVar268._12_4_ * auVar151._12_4_ + auVar264._12_4_ * fVar179) +
         auVar151._12_4_ * fVar283;
    auVar331._16_4_ =
         fVar201 * (auVar268._16_4_ * auVar151._16_4_ + auVar264._0_4_ * fVar201) +
         auVar151._16_4_ * fVar286;
    auVar331._20_4_ =
         fVar202 * (auVar268._20_4_ * auVar151._20_4_ + auVar264._4_4_ * fVar202) +
         auVar151._20_4_ * fVar289;
    auVar331._24_4_ =
         fVar203 * (auVar268._24_4_ * auVar151._24_4_ + auVar264._8_4_ * fVar203) +
         auVar151._24_4_ * fVar292;
    auVar331._28_4_ = local_2e0._28_4_ + fVar355;
    auVar337._0_4_ =
         fVar259 * (auVar388._0_4_ * auVar151._0_4_ + auVar329._0_4_ * fVar259) +
         auVar151._0_4_ * fVar228;
    auVar337._4_4_ =
         fVar94 * (auVar388._4_4_ * auVar151._4_4_ + auVar329._4_4_ * fVar94) +
         auVar151._4_4_ * fVar230;
    auVar337._8_4_ =
         fVar95 * (auVar388._8_4_ * auVar151._8_4_ + auVar329._8_4_ * fVar95) +
         auVar151._8_4_ * fVar235;
    auVar337._12_4_ =
         fVar179 * (auVar388._12_4_ * auVar151._12_4_ + auVar329._12_4_ * fVar179) +
         auVar151._12_4_ * fVar250;
    auVar337._16_4_ =
         fVar201 * (auVar388._16_4_ * auVar151._16_4_ + auVar329._16_4_ * fVar201) +
         auVar151._16_4_ * fVar252;
    auVar337._20_4_ =
         fVar202 * (auVar388._20_4_ * auVar151._20_4_ + auVar329._20_4_ * fVar202) +
         auVar151._20_4_ * fVar254;
    auVar337._24_4_ =
         fVar203 * (auVar388._24_4_ * auVar151._24_4_ + auVar329._24_4_ * fVar203) +
         auVar151._24_4_ * fVar204;
    auVar337._28_4_ = fStack_1c4 + fVar355;
    fVar226 = local_2c0._28_4_;
    auVar346._0_4_ =
         fVar259 * (auVar391._0_4_ * auVar151._0_4_ + auVar348._0_4_ * fVar259) +
         auVar151._0_4_ * fVar207;
    auVar346._4_4_ =
         fVar94 * (auVar391._4_4_ * auVar151._4_4_ + auVar348._4_4_ * fVar94) +
         auVar151._4_4_ * fVar227;
    auVar346._8_4_ =
         fVar95 * (auVar391._8_4_ * auVar151._8_4_ + auVar348._8_4_ * fVar95) +
         auVar151._8_4_ * fVar229;
    auVar346._12_4_ =
         fVar179 * (auVar391._12_4_ * auVar151._12_4_ + auVar348._12_4_ * fVar179) +
         auVar151._12_4_ * fVar231;
    auVar346._16_4_ =
         fVar201 * (auVar391._16_4_ * auVar151._16_4_ + auVar348._16_4_ * fVar201) +
         auVar151._16_4_ * fVar232;
    auVar346._20_4_ =
         fVar202 * (auVar391._20_4_ * auVar151._20_4_ + auVar348._20_4_ * fVar202) +
         auVar151._20_4_ * fVar233;
    auVar346._24_4_ =
         fVar203 * (auVar391._24_4_ * auVar151._24_4_ + auVar348._24_4_ * fVar203) +
         auVar151._24_4_ * fVar234;
    auVar346._28_4_ = fVar226 + fVar355;
    auVar302._0_4_ =
         auVar151._0_4_ * fVar236 +
         fVar259 * (auVar276._0_4_ * auVar151._0_4_ + auVar19._0_4_ * fVar259);
    auVar302._4_4_ =
         auVar151._4_4_ * fVar251 +
         fVar94 * (auVar276._4_4_ * auVar151._4_4_ + auVar19._4_4_ * fVar94);
    auVar302._8_4_ =
         auVar151._8_4_ * fVar253 +
         fVar95 * (auVar276._8_4_ * auVar151._8_4_ + auVar19._8_4_ * fVar95);
    auVar302._12_4_ =
         auVar151._12_4_ * fVar255 +
         fVar179 * (auVar276._12_4_ * auVar151._12_4_ + fVar361 * fVar179);
    auVar302._16_4_ =
         auVar151._16_4_ * fVar256 +
         fVar201 * (auVar276._16_4_ * auVar151._16_4_ + auVar19._0_4_ * fVar201);
    auVar302._20_4_ =
         auVar151._20_4_ * fVar257 +
         fVar202 * (auVar276._20_4_ * auVar151._20_4_ + auVar19._4_4_ * fVar202);
    auVar302._24_4_ =
         auVar151._24_4_ * fVar258 +
         fVar203 * (auVar276._24_4_ * auVar151._24_4_ + auVar19._8_4_ * fVar203);
    auVar302._28_4_ = fVar226 + fStack_1e4;
    auVar269._0_4_ =
         (auVar151._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar259) * auVar151._0_4_ +
         fVar259 * fVar260;
    auVar269._4_4_ =
         (auVar151._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar94) * auVar151._4_4_ +
         fVar94 * fVar277;
    auVar269._8_4_ =
         (auVar151._8_4_ * fStack_218 + local_2c0._8_4_ * fVar95) * auVar151._8_4_ +
         fVar95 * fVar280;
    auVar269._12_4_ =
         (auVar151._12_4_ * fStack_214 + local_2c0._12_4_ * fVar179) * auVar151._12_4_ +
         fVar179 * fVar283;
    auVar269._16_4_ =
         (auVar151._16_4_ * fStack_210 + local_2c0._16_4_ * fVar201) * auVar151._16_4_ +
         fVar201 * fVar286;
    auVar269._20_4_ =
         (auVar151._20_4_ * fStack_20c + local_2c0._20_4_ * fVar202) * auVar151._20_4_ +
         fVar202 * fVar289;
    auVar269._24_4_ =
         (auVar151._24_4_ * fStack_208 + local_2c0._24_4_ * fVar203) * auVar151._24_4_ +
         fVar203 * fVar292;
    auVar269._28_4_ = fVar226 + fVar205 + auVar276._28_4_;
    auVar197._0_4_ =
         (auVar151._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar259) * auVar151._0_4_ +
         fVar259 * fVar228;
    auVar197._4_4_ =
         (auVar151._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar94) * auVar151._4_4_ +
         fVar94 * fVar230;
    auVar197._8_4_ =
         (auVar151._8_4_ * fStack_238 + local_2e0._8_4_ * fVar95) * auVar151._8_4_ +
         fVar95 * fVar235;
    auVar197._12_4_ =
         (auVar151._12_4_ * fStack_234 + local_2e0._12_4_ * fVar179) * auVar151._12_4_ +
         fVar179 * fVar250;
    auVar197._16_4_ =
         (auVar151._16_4_ * fStack_230 + local_2e0._16_4_ * fVar201) * auVar151._16_4_ +
         fVar201 * fVar252;
    auVar197._20_4_ =
         (auVar151._20_4_ * fStack_22c + local_2e0._20_4_ * fVar202) * auVar151._20_4_ +
         fVar202 * fVar254;
    auVar197._24_4_ =
         (auVar151._24_4_ * fStack_228 + local_2e0._24_4_ * fVar203) * auVar151._24_4_ +
         fVar203 * fVar204;
    auVar197._28_4_ = fVar226 + fVar205 + 1.0;
    auVar221._0_4_ =
         (auVar151._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar259) *
         auVar151._0_4_ + fVar259 * fVar207;
    auVar221._4_4_ =
         (auVar151._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar94) *
         auVar151._4_4_ + fVar94 * fVar227;
    auVar221._8_4_ =
         (auVar151._8_4_ * fStack_258 + fStack_1d8 * fVar95) * auVar151._8_4_ + fVar95 * fVar229;
    auVar221._12_4_ =
         (auVar151._12_4_ * fStack_254 + fStack_1d4 * fVar179) * auVar151._12_4_ + fVar179 * fVar231
    ;
    auVar221._16_4_ =
         (auVar151._16_4_ * fStack_250 + fStack_1d0 * fVar201) * auVar151._16_4_ + fVar201 * fVar232
    ;
    auVar221._20_4_ =
         (auVar151._20_4_ * fStack_24c + fStack_1cc * fVar202) * auVar151._20_4_ + fVar202 * fVar233
    ;
    auVar221._24_4_ =
         (auVar151._24_4_ * fStack_248 + fStack_1c8 * fVar203) * auVar151._24_4_ + fVar203 * fVar234
    ;
    auVar221._28_4_ = fVar366 + fVar206 + 1.0;
    auVar243._0_4_ =
         (auVar151._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar259) *
         auVar151._0_4_ + fVar259 * fVar236;
    auVar243._4_4_ =
         (auVar151._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar94) *
         auVar151._4_4_ + fVar94 * fVar251;
    auVar243._8_4_ =
         (auVar151._8_4_ * fStack_278 + fStack_1f8 * fVar95) * auVar151._8_4_ + fVar95 * fVar253;
    auVar243._12_4_ =
         (auVar151._12_4_ * fStack_274 + fStack_1f4 * fVar179) * auVar151._12_4_ + fVar179 * fVar255
    ;
    auVar243._16_4_ =
         (auVar151._16_4_ * fStack_270 + fStack_1f0 * fVar201) * auVar151._16_4_ + fVar201 * fVar256
    ;
    auVar243._20_4_ =
         (auVar151._20_4_ * fStack_26c + fStack_1ec * fVar202) * auVar151._20_4_ + fVar202 * fVar257
    ;
    auVar243._24_4_ =
         (auVar151._24_4_ * fStack_268 + fStack_1e8 * fVar203) * auVar151._24_4_ + fVar203 * fVar258
    ;
    auVar243._28_4_ = fVar355 + fVar206 + fVar355 + fVar206;
    auVar369._0_4_ = auVar331._0_4_ * fVar259 + auVar151._0_4_ * auVar269._0_4_;
    auVar369._4_4_ = auVar331._4_4_ * fVar94 + auVar151._4_4_ * auVar269._4_4_;
    auVar369._8_4_ = auVar331._8_4_ * fVar95 + auVar151._8_4_ * auVar269._8_4_;
    auVar369._12_4_ = auVar331._12_4_ * fVar179 + auVar151._12_4_ * auVar269._12_4_;
    auVar369._16_4_ = auVar331._16_4_ * fVar201 + auVar151._16_4_ * auVar269._16_4_;
    auVar369._20_4_ = auVar331._20_4_ * fVar202 + auVar151._20_4_ * auVar269._20_4_;
    auVar369._24_4_ = auVar331._24_4_ * fVar203 + auVar151._24_4_ * auVar269._24_4_;
    auVar369._28_4_ = fVar355 + fVar206 + fVar226;
    auVar383._0_4_ = auVar337._0_4_ * fVar259 + auVar151._0_4_ * auVar197._0_4_;
    auVar383._4_4_ = auVar337._4_4_ * fVar94 + auVar151._4_4_ * auVar197._4_4_;
    auVar383._8_4_ = auVar337._8_4_ * fVar95 + auVar151._8_4_ * auVar197._8_4_;
    auVar383._12_4_ = auVar337._12_4_ * fVar179 + auVar151._12_4_ * auVar197._12_4_;
    auVar383._16_4_ = auVar337._16_4_ * fVar201 + auVar151._16_4_ * auVar197._16_4_;
    auVar383._20_4_ = auVar337._20_4_ * fVar202 + auVar151._20_4_ * auVar197._20_4_;
    auVar383._24_4_ = auVar337._24_4_ * fVar203 + auVar151._24_4_ * auVar197._24_4_;
    auVar383._28_4_ = fVar226 + fVar366;
    local_5a0._0_4_ = auVar346._0_4_ * fVar259 + auVar151._0_4_ * auVar221._0_4_;
    local_5a0._4_4_ = auVar346._4_4_ * fVar94 + auVar151._4_4_ * auVar221._4_4_;
    fStack_598 = auVar346._8_4_ * fVar95 + auVar151._8_4_ * auVar221._8_4_;
    fStack_594 = auVar346._12_4_ * fVar179 + auVar151._12_4_ * auVar221._12_4_;
    fStack_590 = auVar346._16_4_ * fVar201 + auVar151._16_4_ * auVar221._16_4_;
    fStack_58c = auVar346._20_4_ * fVar202 + auVar151._20_4_ * auVar221._20_4_;
    fStack_588 = auVar346._24_4_ * fVar203 + auVar151._24_4_ * auVar221._24_4_;
    fStack_584 = fVar366 + fVar226;
    local_bc0 = auVar189._0_4_;
    local_700._0_4_ = fVar259 * auVar302._0_4_ + auVar151._0_4_ * auVar243._0_4_;
    local_700._4_4_ = fVar94 * auVar302._4_4_ + auVar151._4_4_ * auVar243._4_4_;
    local_700._8_4_ = fVar95 * auVar302._8_4_ + auVar151._8_4_ * auVar243._8_4_;
    local_700._12_4_ = fVar179 * auVar302._12_4_ + auVar151._12_4_ * auVar243._12_4_;
    local_700._16_4_ = fVar201 * auVar302._16_4_ + auVar151._16_4_ * auVar243._16_4_;
    local_700._20_4_ = fVar202 * auVar302._20_4_ + auVar151._20_4_ * auVar243._20_4_;
    local_700._24_4_ = fVar203 * auVar302._24_4_ + auVar151._24_4_ * auVar243._24_4_;
    local_700._28_4_ = auVar111._28_4_ + auVar151._28_4_;
    auVar111 = vsubps_avx(auVar269,auVar331);
    auVar268 = vsubps_avx(auVar197,auVar337);
    auVar112 = vsubps_avx(auVar221,auVar346);
    auVar151 = vsubps_avx(auVar243,auVar302);
    auVar238 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                           ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar202 = auVar238._0_4_;
    fVar261 = fVar202 * auVar111._0_4_ * 3.0;
    fVar206 = auVar238._4_4_;
    fVar278 = fVar206 * auVar111._4_4_ * 3.0;
    local_a00._4_4_ = fVar278;
    local_a00._0_4_ = fVar261;
    fVar252 = auVar238._8_4_;
    fVar281 = fVar252 * auVar111._8_4_ * 3.0;
    fStack_9f8 = fVar281;
    fVar229 = auVar238._12_4_;
    fVar284 = fVar229 * auVar111._12_4_ * 3.0;
    fStack_9f4 = fVar284;
    fVar287 = fVar202 * auVar111._16_4_ * 3.0;
    unique0x10007bd4 = fVar287;
    fVar290 = fVar206 * auVar111._20_4_ * 3.0;
    unique0x10007bd8 = fVar290;
    fVar293 = fVar252 * auVar111._24_4_ * 3.0;
    unique0x10007bdc = fVar293;
    unique0x10007be0 = auVar269._28_4_;
    fVar295 = fVar202 * auVar268._0_4_ * 3.0;
    fVar305 = fVar206 * auVar268._4_4_ * 3.0;
    auVar304._4_4_ = fVar305;
    auVar304._0_4_ = fVar295;
    fVar307 = fVar252 * auVar268._8_4_ * 3.0;
    auVar304._8_4_ = fVar307;
    fVar310 = fVar229 * auVar268._12_4_ * 3.0;
    auVar304._12_4_ = fVar310;
    fVar313 = fVar202 * auVar268._16_4_ * 3.0;
    auVar304._16_4_ = fVar313;
    fVar316 = fVar206 * auVar268._20_4_ * 3.0;
    auVar304._20_4_ = fVar316;
    fVar319 = fVar252 * auVar268._24_4_ * 3.0;
    auVar304._24_4_ = fVar319;
    auVar304._28_4_ = auVar302._28_4_;
    fVar356 = fVar202 * auVar112._0_4_ * 3.0;
    fVar359 = fVar206 * auVar112._4_4_ * 3.0;
    auVar41._4_4_ = fVar359;
    auVar41._0_4_ = fVar356;
    fVar360 = fVar252 * auVar112._8_4_ * 3.0;
    auVar41._8_4_ = fVar360;
    fVar362 = fVar229 * auVar112._12_4_ * 3.0;
    auVar41._12_4_ = fVar362;
    fVar363 = fVar202 * auVar112._16_4_ * 3.0;
    auVar41._16_4_ = fVar363;
    fVar364 = fVar206 * auVar112._20_4_ * 3.0;
    auVar41._20_4_ = fVar364;
    fVar365 = fVar252 * auVar112._24_4_ * 3.0;
    auVar41._24_4_ = fVar365;
    auVar41._28_4_ = fVar366;
    fVar203 = fVar202 * auVar151._0_4_ * 3.0;
    fVar250 = fVar206 * auVar151._4_4_ * 3.0;
    auVar171._4_4_ = fVar250;
    auVar171._0_4_ = fVar203;
    fVar254 = fVar252 * auVar151._8_4_ * 3.0;
    auVar171._8_4_ = fVar254;
    fVar231 = fVar229 * auVar151._12_4_ * 3.0;
    auVar171._12_4_ = fVar231;
    fVar202 = fVar202 * auVar151._16_4_ * 3.0;
    auVar171._16_4_ = fVar202;
    fVar206 = fVar206 * auVar151._20_4_ * 3.0;
    auVar171._20_4_ = fVar206;
    fVar252 = fVar252 * auVar151._24_4_ * 3.0;
    auVar171._24_4_ = fVar252;
    auVar171._28_4_ = fVar229;
    auVar111 = vperm2f128_avx(auVar383,auVar383,1);
    auVar111 = vshufps_avx(auVar111,auVar383,0x30);
    auVar151 = vshufps_avx(auVar383,auVar111,0x29);
    auVar111 = vperm2f128_avx(_local_5a0,_local_5a0,1);
    auVar111 = vshufps_avx(auVar111,_local_5a0,0x30);
    local_9e0 = vshufps_avx(_local_5a0,auVar111,0x29);
    auVar268 = vsubps_avx(local_700,auVar171);
    auVar111 = vperm2f128_avx(auVar268,auVar268,1);
    auVar111 = vshufps_avx(auVar111,auVar268,0x30);
    auVar171 = vshufps_avx(auVar268,auVar111,0x29);
    local_520 = vsubps_avx(auVar151,auVar383);
    local_500 = vsubps_avx(local_9e0,_local_5a0);
    fVar94 = local_520._0_4_;
    fVar226 = local_520._4_4_;
    auVar35._4_4_ = fVar359 * fVar226;
    auVar35._0_4_ = fVar356 * fVar94;
    fVar204 = local_520._8_4_;
    auVar35._8_4_ = fVar360 * fVar204;
    fVar233 = local_520._12_4_;
    auVar35._12_4_ = fVar362 * fVar233;
    fVar257 = local_520._16_4_;
    auVar35._16_4_ = fVar363 * fVar257;
    fVar289 = local_520._20_4_;
    auVar35._20_4_ = fVar364 * fVar289;
    fVar23 = local_520._24_4_;
    auVar35._24_4_ = fVar365 * fVar23;
    auVar35._28_4_ = auVar268._28_4_;
    fVar344 = local_500._0_4_;
    fVar349 = local_500._4_4_;
    auVar375._4_4_ = fVar349 * fVar305;
    auVar375._0_4_ = fVar344 * fVar295;
    fVar350 = local_500._8_4_;
    auVar375._8_4_ = fVar350 * fVar307;
    fVar351 = local_500._12_4_;
    auVar375._12_4_ = fVar351 * fVar310;
    fVar352 = local_500._16_4_;
    auVar375._16_4_ = fVar352 * fVar313;
    fVar353 = local_500._20_4_;
    auVar375._20_4_ = fVar353 * fVar316;
    fVar354 = local_500._24_4_;
    auVar375._24_4_ = fVar354 * fVar319;
    auVar375._28_4_ = auVar111._28_4_;
    auVar375 = vsubps_avx(auVar375,auVar35);
    auVar111 = vperm2f128_avx(auVar369,auVar369,1);
    auVar111 = vshufps_avx(auVar111,auVar369,0x30);
    auVar35 = vshufps_avx(auVar369,auVar111,0x29);
    local_540 = vsubps_avx(auVar35,auVar369);
    auVar37._4_4_ = fVar349 * fVar278;
    auVar37._0_4_ = fVar344 * fVar261;
    auVar37._8_4_ = fVar350 * fVar281;
    auVar37._12_4_ = fVar351 * fVar284;
    auVar37._16_4_ = fVar352 * fVar287;
    auVar37._20_4_ = fVar353 * fVar290;
    auVar37._24_4_ = fVar354 * fVar293;
    auVar37._28_4_ = auVar35._28_4_;
    fVar95 = local_540._0_4_;
    fVar228 = local_540._4_4_;
    auVar38._4_4_ = fVar359 * fVar228;
    auVar38._0_4_ = fVar356 * fVar95;
    fVar205 = local_540._8_4_;
    auVar38._8_4_ = fVar360 * fVar205;
    fVar234 = local_540._12_4_;
    auVar38._12_4_ = fVar362 * fVar234;
    fVar258 = local_540._16_4_;
    auVar38._16_4_ = fVar363 * fVar258;
    fVar292 = local_540._20_4_;
    auVar38._20_4_ = fVar364 * fVar292;
    fVar24 = local_540._24_4_;
    auVar38._24_4_ = fVar365 * fVar24;
    auVar38._28_4_ = local_9e0._28_4_;
    auVar37 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar228 * fVar305;
    auVar39._0_4_ = fVar95 * fVar295;
    auVar39._8_4_ = fVar205 * fVar307;
    auVar39._12_4_ = fVar234 * fVar310;
    auVar39._16_4_ = fVar258 * fVar313;
    auVar39._20_4_ = fVar292 * fVar316;
    auVar39._24_4_ = fVar24 * fVar319;
    auVar39._28_4_ = local_9e0._28_4_;
    auVar40._4_4_ = fVar278 * fVar226;
    auVar40._0_4_ = fVar261 * fVar94;
    auVar40._8_4_ = fVar281 * fVar204;
    auVar40._12_4_ = fVar284 * fVar233;
    auVar40._16_4_ = fVar287 * fVar257;
    auVar40._20_4_ = fVar290 * fVar289;
    auVar40._24_4_ = fVar293 * fVar23;
    auVar40._28_4_ = auVar337._28_4_;
    auVar38 = vsubps_avx(auVar40,auVar39);
    fVar259 = auVar38._28_4_;
    auVar170._0_4_ = fVar95 * fVar95 + fVar94 * fVar94 + fVar344 * fVar344;
    auVar170._4_4_ = fVar228 * fVar228 + fVar226 * fVar226 + fVar349 * fVar349;
    auVar170._8_4_ = fVar205 * fVar205 + fVar204 * fVar204 + fVar350 * fVar350;
    auVar170._12_4_ = fVar234 * fVar234 + fVar233 * fVar233 + fVar351 * fVar351;
    auVar170._16_4_ = fVar258 * fVar258 + fVar257 * fVar257 + fVar352 * fVar352;
    auVar170._20_4_ = fVar292 * fVar292 + fVar289 * fVar289 + fVar353 * fVar353;
    auVar170._24_4_ = fVar24 * fVar24 + fVar23 * fVar23 + fVar354 * fVar354;
    auVar170._28_4_ = fVar259 + fVar259 + auVar375._28_4_;
    auVar111 = vrcpps_avx(auVar170);
    fVar232 = auVar111._0_4_;
    fVar253 = auVar111._4_4_;
    auVar18._4_4_ = fVar253 * auVar170._4_4_;
    auVar18._0_4_ = fVar232 * auVar170._0_4_;
    fVar255 = auVar111._8_4_;
    auVar18._8_4_ = fVar255 * auVar170._8_4_;
    fVar256 = auVar111._12_4_;
    auVar18._12_4_ = fVar256 * auVar170._12_4_;
    fVar280 = auVar111._16_4_;
    auVar18._16_4_ = fVar280 * auVar170._16_4_;
    fVar283 = auVar111._20_4_;
    auVar18._20_4_ = fVar283 * auVar170._20_4_;
    fVar286 = auVar111._24_4_;
    auVar18._24_4_ = fVar286 * auVar170._24_4_;
    auVar18._28_4_ = auVar337._28_4_;
    auVar370._8_4_ = 0x3f800000;
    auVar370._0_8_ = 0x3f8000003f800000;
    auVar370._12_4_ = 0x3f800000;
    auVar370._16_4_ = 0x3f800000;
    auVar370._20_4_ = 0x3f800000;
    auVar370._24_4_ = 0x3f800000;
    auVar370._28_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar370,auVar18);
    fVar232 = auVar39._0_4_ * fVar232 + fVar232;
    fVar253 = auVar39._4_4_ * fVar253 + fVar253;
    fVar255 = auVar39._8_4_ * fVar255 + fVar255;
    fVar256 = auVar39._12_4_ * fVar256 + fVar256;
    fVar280 = auVar39._16_4_ * fVar280 + fVar280;
    fVar283 = auVar39._20_4_ * fVar283 + fVar283;
    fVar286 = auVar39._24_4_ * fVar286 + fVar286;
    auVar268 = vperm2f128_avx(auVar304,auVar304,1);
    auVar268 = vshufps_avx(auVar268,auVar304,0x30);
    auVar268 = vshufps_avx(auVar304,auVar268,0x29);
    auVar112 = vperm2f128_avx(auVar41,auVar41,1);
    auVar112 = vshufps_avx(auVar112,auVar41,0x30);
    local_6a0 = vshufps_avx(auVar41,auVar112,0x29);
    fVar367 = local_6a0._0_4_;
    fVar376 = local_6a0._4_4_;
    auVar36._4_4_ = fVar376 * fVar226;
    auVar36._0_4_ = fVar367 * fVar94;
    fVar377 = local_6a0._8_4_;
    auVar36._8_4_ = fVar377 * fVar204;
    fVar378 = local_6a0._12_4_;
    auVar36._12_4_ = fVar378 * fVar233;
    fVar379 = local_6a0._16_4_;
    auVar36._16_4_ = fVar379 * fVar257;
    fVar380 = local_6a0._20_4_;
    auVar36._20_4_ = fVar380 * fVar289;
    fVar381 = local_6a0._24_4_;
    auVar36._24_4_ = fVar381 * fVar23;
    auVar36._28_4_ = auVar112._28_4_;
    fVar179 = auVar268._0_4_;
    fVar230 = auVar268._4_4_;
    auVar42._4_4_ = fVar349 * fVar230;
    auVar42._0_4_ = fVar344 * fVar179;
    fVar207 = auVar268._8_4_;
    auVar42._8_4_ = fVar350 * fVar207;
    fVar236 = auVar268._12_4_;
    auVar42._12_4_ = fVar351 * fVar236;
    fVar260 = auVar268._16_4_;
    auVar42._16_4_ = fVar352 * fVar260;
    fVar355 = auVar268._20_4_;
    auVar42._20_4_ = fVar353 * fVar355;
    fVar25 = auVar268._24_4_;
    auVar42._24_4_ = fVar354 * fVar25;
    auVar42._28_4_ = fVar366;
    auVar112 = vsubps_avx(auVar42,auVar36);
    auVar268 = vperm2f128_avx(_local_a00,_local_a00,1);
    auVar268 = vshufps_avx(auVar268,_local_a00,0x30);
    local_920 = vshufps_avx(_local_a00,auVar268,0x29);
    fVar201 = local_920._0_4_;
    fVar235 = local_920._4_4_;
    auVar43._4_4_ = fVar349 * fVar235;
    auVar43._0_4_ = fVar344 * fVar201;
    fVar227 = local_920._8_4_;
    auVar43._8_4_ = fVar350 * fVar227;
    fVar251 = local_920._12_4_;
    auVar43._12_4_ = fVar351 * fVar251;
    fVar277 = local_920._16_4_;
    auVar43._16_4_ = fVar352 * fVar277;
    fVar366 = local_920._20_4_;
    auVar43._20_4_ = fVar353 * fVar366;
    fVar26 = local_920._24_4_;
    auVar43._24_4_ = fVar354 * fVar26;
    auVar43._28_4_ = auVar268._28_4_;
    auVar44._4_4_ = fVar376 * fVar228;
    auVar44._0_4_ = fVar367 * fVar95;
    auVar44._8_4_ = fVar377 * fVar205;
    auVar44._12_4_ = fVar378 * fVar234;
    auVar44._16_4_ = fVar379 * fVar258;
    auVar44._20_4_ = fVar380 * fVar292;
    uVar86 = local_6a0._28_4_;
    auVar44._24_4_ = fVar381 * fVar24;
    auVar44._28_4_ = uVar86;
    auVar268 = vsubps_avx(auVar44,auVar43);
    auVar45._4_4_ = fVar228 * fVar230;
    auVar45._0_4_ = fVar95 * fVar179;
    auVar45._8_4_ = fVar205 * fVar207;
    auVar45._12_4_ = fVar234 * fVar236;
    auVar45._16_4_ = fVar258 * fVar260;
    auVar45._20_4_ = fVar292 * fVar355;
    auVar45._24_4_ = fVar24 * fVar25;
    auVar45._28_4_ = uVar86;
    auVar46._4_4_ = fVar235 * fVar226;
    auVar46._0_4_ = fVar201 * fVar94;
    auVar46._8_4_ = fVar227 * fVar204;
    auVar46._12_4_ = fVar251 * fVar233;
    auVar46._16_4_ = fVar277 * fVar257;
    auVar46._20_4_ = fVar366 * fVar289;
    auVar46._24_4_ = fVar26 * fVar23;
    auVar46._28_4_ = auVar383._28_4_;
    auVar304 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ =
         (auVar375._4_4_ * auVar375._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar253;
    auVar47._0_4_ =
         (auVar375._0_4_ * auVar375._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar232;
    auVar47._8_4_ =
         (auVar375._8_4_ * auVar375._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar255;
    auVar47._12_4_ =
         (auVar375._12_4_ * auVar375._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar256;
    auVar47._16_4_ =
         (auVar375._16_4_ * auVar375._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar280;
    auVar47._20_4_ =
         (auVar375._20_4_ * auVar375._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar283;
    auVar47._24_4_ =
         (auVar375._24_4_ * auVar375._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar286;
    auVar47._28_4_ = auVar375._28_4_ + auVar37._28_4_ + fVar259;
    auVar48._4_4_ =
         (auVar112._4_4_ * auVar112._4_4_ +
         auVar268._4_4_ * auVar268._4_4_ + auVar304._4_4_ * auVar304._4_4_) * fVar253;
    auVar48._0_4_ =
         (auVar112._0_4_ * auVar112._0_4_ +
         auVar268._0_4_ * auVar268._0_4_ + auVar304._0_4_ * auVar304._0_4_) * fVar232;
    auVar48._8_4_ =
         (auVar112._8_4_ * auVar112._8_4_ +
         auVar268._8_4_ * auVar268._8_4_ + auVar304._8_4_ * auVar304._8_4_) * fVar255;
    auVar48._12_4_ =
         (auVar112._12_4_ * auVar112._12_4_ +
         auVar268._12_4_ * auVar268._12_4_ + auVar304._12_4_ * auVar304._12_4_) * fVar256;
    auVar48._16_4_ =
         (auVar112._16_4_ * auVar112._16_4_ +
         auVar268._16_4_ * auVar268._16_4_ + auVar304._16_4_ * auVar304._16_4_) * fVar280;
    auVar48._20_4_ =
         (auVar112._20_4_ * auVar112._20_4_ +
         auVar268._20_4_ * auVar268._20_4_ + auVar304._20_4_ * auVar304._20_4_) * fVar283;
    auVar48._24_4_ =
         (auVar112._24_4_ * auVar112._24_4_ +
         auVar268._24_4_ * auVar268._24_4_ + auVar304._24_4_ * auVar304._24_4_) * fVar286;
    auVar48._28_4_ = auVar39._28_4_ + auVar111._28_4_;
    auVar111 = vmaxps_avx(auVar47,auVar48);
    auVar268 = vperm2f128_avx(local_700,local_700,1);
    auVar268 = vshufps_avx(auVar268,local_700,0x30);
    auVar375 = vshufps_avx(local_700,auVar268,0x29);
    auVar113._0_4_ = (float)local_700._0_4_ + fVar203;
    auVar113._4_4_ = local_700._4_4_ + fVar250;
    auVar113._8_4_ = local_700._8_4_ + fVar254;
    auVar113._12_4_ = local_700._12_4_ + fVar231;
    auVar113._16_4_ = local_700._16_4_ + fVar202;
    auVar113._20_4_ = local_700._20_4_ + fVar206;
    auVar113._24_4_ = local_700._24_4_ + fVar252;
    auVar113._28_4_ = local_700._28_4_ + fVar229;
    auVar268 = vmaxps_avx(local_700,auVar113);
    auVar112 = vmaxps_avx(auVar171,auVar375);
    auVar268 = vmaxps_avx(auVar268,auVar112);
    auVar112 = vrsqrtps_avx(auVar170);
    fVar259 = auVar112._0_4_;
    fVar202 = auVar112._4_4_;
    fVar203 = auVar112._8_4_;
    fVar206 = auVar112._12_4_;
    fVar250 = auVar112._16_4_;
    fVar252 = auVar112._20_4_;
    fVar254 = auVar112._24_4_;
    local_320 = fVar259 * 1.5 + fVar259 * fVar259 * fVar259 * auVar170._0_4_ * -0.5;
    fStack_31c = fVar202 * 1.5 + fVar202 * fVar202 * fVar202 * auVar170._4_4_ * -0.5;
    fStack_318 = fVar203 * 1.5 + fVar203 * fVar203 * fVar203 * auVar170._8_4_ * -0.5;
    fStack_314 = fVar206 * 1.5 + fVar206 * fVar206 * fVar206 * auVar170._12_4_ * -0.5;
    fStack_310 = fVar250 * 1.5 + fVar250 * fVar250 * fVar250 * auVar170._16_4_ * -0.5;
    fStack_30c = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar170._20_4_ * -0.5;
    fStack_308 = fVar254 * 1.5 + fVar254 * fVar254 * fVar254 * auVar170._24_4_ * -0.5;
    auVar37 = vsubps_avx(ZEXT832(0) << 0x20,auVar383);
    auVar38 = vsubps_avx(ZEXT832(0) << 0x20,_local_5a0);
    fVar202 = auVar38._0_4_;
    fVar250 = auVar38._4_4_;
    fVar229 = auVar38._8_4_;
    fVar253 = auVar38._12_4_;
    fVar280 = auVar38._16_4_;
    fVar20 = auVar38._20_4_;
    fVar27 = auVar38._24_4_;
    fVar203 = auVar37._0_4_;
    fVar252 = auVar37._4_4_;
    fVar231 = auVar37._8_4_;
    fVar255 = auVar37._12_4_;
    fVar283 = auVar37._16_4_;
    fVar21 = auVar37._20_4_;
    fVar28 = auVar37._24_4_;
    auVar39 = vsubps_avx(ZEXT832(0) << 0x20,auVar369);
    fVar206 = auVar39._0_4_;
    fVar254 = auVar39._4_4_;
    fVar232 = auVar39._8_4_;
    fVar256 = auVar39._12_4_;
    fVar286 = auVar39._16_4_;
    fVar22 = auVar39._20_4_;
    fVar29 = auVar39._24_4_;
    auVar371._0_4_ =
         (float)local_740._0_4_ * fVar206 +
         (float)local_760._0_4_ * fVar203 + (float)local_720._0_4_ * fVar202;
    auVar371._4_4_ =
         (float)local_740._4_4_ * fVar254 +
         (float)local_760._4_4_ * fVar252 + (float)local_720._4_4_ * fVar250;
    auVar371._8_4_ = fStack_738 * fVar232 + fStack_758 * fVar231 + fStack_718 * fVar229;
    auVar371._12_4_ = fStack_734 * fVar256 + fStack_754 * fVar255 + fStack_714 * fVar253;
    auVar371._16_4_ = fStack_730 * fVar286 + fStack_750 * fVar283 + fStack_710 * fVar280;
    auVar371._20_4_ = fStack_72c * fVar22 + fStack_74c * fVar21 + fStack_70c * fVar20;
    auVar371._24_4_ = fStack_728 * fVar29 + fStack_748 * fVar28 + fStack_708 * fVar27;
    auVar371._28_4_ = auVar383._28_4_ + auVar304._28_4_ + 1.5;
    auVar384._0_4_ = fVar206 * fVar206 + fVar203 * fVar203 + fVar202 * fVar202;
    auVar384._4_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar250 * fVar250;
    auVar384._8_4_ = fVar232 * fVar232 + fVar231 * fVar231 + fVar229 * fVar229;
    auVar384._12_4_ = fVar256 * fVar256 + fVar255 * fVar255 + fVar253 * fVar253;
    auVar384._16_4_ = fVar286 * fVar286 + fVar283 * fVar283 + fVar280 * fVar280;
    auVar384._20_4_ = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
    auVar384._24_4_ = fVar29 * fVar29 + fVar28 * fVar28 + fVar27 * fVar27;
    auVar384._28_4_ = fStack_584 + fStack_584 + auVar383._28_4_;
    local_460 = (float)local_740._0_4_ * fVar95 * local_320 +
                local_320 * fVar94 * (float)local_760._0_4_ +
                (float)local_720._0_4_ * fVar344 * local_320;
    fStack_45c = (float)local_740._4_4_ * fVar228 * fStack_31c +
                 fStack_31c * fVar226 * (float)local_760._4_4_ +
                 (float)local_720._4_4_ * fVar349 * fStack_31c;
    fStack_458 = fStack_738 * fVar205 * fStack_318 +
                 fStack_318 * fVar204 * fStack_758 + fStack_718 * fVar350 * fStack_318;
    fStack_454 = fStack_734 * fVar234 * fStack_314 +
                 fStack_314 * fVar233 * fStack_754 + fStack_714 * fVar351 * fStack_314;
    fStack_450 = fStack_730 * fVar258 * fStack_310 +
                 fStack_310 * fVar257 * fStack_750 + fStack_710 * fVar352 * fStack_310;
    fStack_44c = fStack_72c * fVar292 * fStack_30c +
                 fStack_30c * fVar289 * fStack_74c + fStack_70c * fVar353 * fStack_30c;
    fStack_448 = fStack_728 * fVar24 * fStack_308 +
                 fStack_308 * fVar23 * fStack_748 + fStack_708 * fVar354 * fStack_308;
    fVar259 = fStack_724 + fStack_744 + 0.0;
    fVar296 = fVar206 * fVar95 * local_320 +
              local_320 * fVar94 * fVar203 + fVar344 * local_320 * fVar202;
    fVar306 = fVar254 * fVar228 * fStack_31c +
              fStack_31c * fVar226 * fVar252 + fVar349 * fStack_31c * fVar250;
    fVar308 = fVar232 * fVar205 * fStack_318 +
              fStack_318 * fVar204 * fVar231 + fVar350 * fStack_318 * fVar229;
    fVar311 = fVar256 * fVar234 * fStack_314 +
              fStack_314 * fVar233 * fVar255 + fVar351 * fStack_314 * fVar253;
    fVar314 = fVar286 * fVar258 * fStack_310 +
              fStack_310 * fVar257 * fVar283 + fVar352 * fStack_310 * fVar280;
    fVar317 = fVar22 * fVar292 * fStack_30c +
              fStack_30c * fVar289 * fVar21 + fVar353 * fStack_30c * fVar20;
    fVar320 = fVar29 * fVar24 * fStack_308 +
              fStack_308 * fVar23 * fVar28 + fVar354 * fStack_308 * fVar27;
    fVar322 = fStack_744 + fVar259;
    auVar49._4_4_ = fStack_45c * fVar306;
    auVar49._0_4_ = local_460 * fVar296;
    auVar49._8_4_ = fStack_458 * fVar308;
    auVar49._12_4_ = fStack_454 * fVar311;
    auVar49._16_4_ = fStack_450 * fVar314;
    auVar49._20_4_ = fStack_44c * fVar317;
    auVar49._24_4_ = fStack_448 * fVar320;
    auVar49._28_4_ = fVar259;
    auVar304 = vsubps_avx(auVar371,auVar49);
    auVar50._4_4_ = fVar306 * fVar306;
    auVar50._0_4_ = fVar296 * fVar296;
    auVar50._8_4_ = fVar308 * fVar308;
    auVar50._12_4_ = fVar311 * fVar311;
    auVar50._16_4_ = fVar314 * fVar314;
    auVar50._20_4_ = fVar317 * fVar317;
    auVar50._24_4_ = fVar320 * fVar320;
    auVar50._28_4_ = fStack_744;
    auVar40 = vsubps_avx(auVar384,auVar50);
    local_4e0 = vsqrtps_avx(auVar111);
    fVar259 = (local_4e0._0_4_ + auVar268._0_4_) * 1.0000002;
    fVar124 = (local_4e0._4_4_ + auVar268._4_4_) * 1.0000002;
    fVar126 = (local_4e0._8_4_ + auVar268._8_4_) * 1.0000002;
    fVar128 = (local_4e0._12_4_ + auVar268._12_4_) * 1.0000002;
    fVar129 = (local_4e0._16_4_ + auVar268._16_4_) * 1.0000002;
    fVar130 = (local_4e0._20_4_ + auVar268._20_4_) * 1.0000002;
    fVar131 = (local_4e0._24_4_ + auVar268._24_4_) * 1.0000002;
    auVar51._4_4_ = fVar124 * fVar124;
    auVar51._0_4_ = fVar259 * fVar259;
    auVar51._8_4_ = fVar126 * fVar126;
    auVar51._12_4_ = fVar128 * fVar128;
    auVar51._16_4_ = fVar129 * fVar129;
    auVar51._20_4_ = fVar130 * fVar130;
    auVar51._24_4_ = fVar131 * fVar131;
    auVar51._28_4_ = local_4e0._28_4_ + auVar268._28_4_;
    fVar334 = auVar304._0_4_ + auVar304._0_4_;
    fVar343 = auVar304._4_4_ + auVar304._4_4_;
    local_8c0._0_8_ = CONCAT44(fVar343,fVar334);
    local_8c0._8_4_ = auVar304._8_4_ + auVar304._8_4_;
    local_8c0._12_4_ = auVar304._12_4_ + auVar304._12_4_;
    local_8c0._16_4_ = auVar304._16_4_ + auVar304._16_4_;
    local_8c0._20_4_ = auVar304._20_4_ + auVar304._20_4_;
    local_8c0._24_4_ = auVar304._24_4_ + auVar304._24_4_;
    local_8c0._28_4_ = auVar304._28_4_ + auVar304._28_4_;
    auVar268 = vsubps_avx(auVar40,auVar51);
    local_340._4_4_ = fStack_45c * fStack_45c;
    local_340._0_4_ = local_460 * local_460;
    local_340._8_4_ = fStack_458 * fStack_458;
    local_340._12_4_ = fStack_454 * fStack_454;
    local_340._16_4_ = fStack_450 * fStack_450;
    local_340._20_4_ = fStack_44c * fStack_44c;
    local_340._24_4_ = fStack_448 * fStack_448;
    local_340._28_4_ = local_500._28_4_;
    local_440 = vsubps_avx(local_2a0,local_340);
    auVar52._4_4_ = fVar343 * fVar343;
    auVar52._0_4_ = fVar334 * fVar334;
    auVar52._8_4_ = local_8c0._8_4_ * local_8c0._8_4_;
    auVar52._12_4_ = local_8c0._12_4_ * local_8c0._12_4_;
    auVar52._16_4_ = local_8c0._16_4_ * local_8c0._16_4_;
    auVar52._20_4_ = local_8c0._20_4_ * local_8c0._20_4_;
    auVar52._24_4_ = local_8c0._24_4_ * local_8c0._24_4_;
    auVar52._28_4_ = 0x3f800002;
    auStack_898 = auVar52._8_24_;
    fVar124 = local_440._0_4_;
    local_4c0._0_4_ = fVar124 * 4.0;
    fVar126 = local_440._4_4_;
    local_4c0._4_4_ = fVar126 * 4.0;
    fVar128 = local_440._8_4_;
    fStack_4b8 = fVar128 * 4.0;
    fVar129 = local_440._12_4_;
    fStack_4b4 = fVar129 * 4.0;
    fVar130 = local_440._16_4_;
    fStack_4b0 = fVar130 * 4.0;
    fVar131 = local_440._20_4_;
    fStack_4ac = fVar131 * 4.0;
    fVar333 = local_440._24_4_;
    fStack_4a8 = fVar333 * 4.0;
    uStack_4a4 = 0x40800000;
    auVar53._4_4_ = auVar268._4_4_ * (float)local_4c0._4_4_;
    auVar53._0_4_ = auVar268._0_4_ * (float)local_4c0._0_4_;
    auVar53._8_4_ = auVar268._8_4_ * fStack_4b8;
    auVar53._12_4_ = auVar268._12_4_ * fStack_4b4;
    auVar53._16_4_ = auVar268._16_4_ * fStack_4b0;
    auVar53._20_4_ = auVar268._20_4_ * fStack_4ac;
    auVar53._24_4_ = auVar268._24_4_ * fStack_4a8;
    auVar53._28_4_ = 0x40800000;
    auVar304 = vsubps_avx(auVar52,auVar53);
    auVar111 = vcmpps_avx(auVar304,ZEXT832(0) << 0x20,5);
    fVar259 = local_440._28_4_;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      auVar114._8_4_ = 0x7f800000;
      auVar114._0_8_ = 0x7f8000007f800000;
      auVar114._12_4_ = 0x7f800000;
      auVar114._16_4_ = 0x7f800000;
      auVar114._20_4_ = 0x7f800000;
      auVar114._24_4_ = 0x7f800000;
      auVar114._28_4_ = 0x7f800000;
      auVar385._8_4_ = 0xff800000;
      auVar385._0_8_ = 0xff800000ff800000;
      auVar385._12_4_ = 0xff800000;
      auVar385._16_4_ = 0xff800000;
      auVar385._20_4_ = 0xff800000;
      auVar385._24_4_ = 0xff800000;
      auVar385._28_4_ = 0xff800000;
    }
    else {
      local_560 = auVar111;
      auVar18 = vcmpps_avx(auVar304,ZEXT832(0) << 0x20,5);
      auVar36 = vsqrtps_avx(auVar304);
      auVar270._0_4_ = fVar124 + fVar124;
      auVar270._4_4_ = fVar126 + fVar126;
      auVar270._8_4_ = fVar128 + fVar128;
      auVar270._12_4_ = fVar129 + fVar129;
      auVar270._16_4_ = fVar130 + fVar130;
      auVar270._20_4_ = fVar131 + fVar131;
      auVar270._24_4_ = fVar333 + fVar333;
      auVar270._28_4_ = fVar259 + fVar259;
      auVar304 = vrcpps_avx(auVar270);
      fVar262 = auVar304._0_4_;
      fVar279 = auVar304._4_4_;
      auVar54._4_4_ = auVar270._4_4_ * fVar279;
      auVar54._0_4_ = auVar270._0_4_ * fVar262;
      fVar282 = auVar304._8_4_;
      auVar54._8_4_ = auVar270._8_4_ * fVar282;
      fVar285 = auVar304._12_4_;
      auVar54._12_4_ = auVar270._12_4_ * fVar285;
      fVar288 = auVar304._16_4_;
      auVar54._16_4_ = auVar270._16_4_ * fVar288;
      fVar291 = auVar304._20_4_;
      auVar54._20_4_ = auVar270._20_4_ * fVar291;
      fVar294 = auVar304._24_4_;
      auVar54._24_4_ = auVar270._24_4_ * fVar294;
      auVar54._28_4_ = auVar270._28_4_;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar304 = vsubps_avx(auVar328,auVar54);
      fVar262 = fVar262 + fVar262 * auVar304._0_4_;
      fVar279 = fVar279 + fVar279 * auVar304._4_4_;
      fVar282 = fVar282 + fVar282 * auVar304._8_4_;
      fVar285 = fVar285 + fVar285 * auVar304._12_4_;
      fVar288 = fVar288 + fVar288 * auVar304._16_4_;
      fVar291 = fVar291 + fVar291 * auVar304._20_4_;
      fVar294 = fVar294 + fVar294 * auVar304._24_4_;
      auVar303._0_8_ = CONCAT44(fVar343,fVar334) ^ 0x8000000080000000;
      auVar303._8_4_ = -local_8c0._8_4_;
      auVar303._12_4_ = -local_8c0._12_4_;
      auVar303._16_4_ = -local_8c0._16_4_;
      auVar303._20_4_ = -local_8c0._20_4_;
      auVar303._24_4_ = -local_8c0._24_4_;
      auVar303._28_4_ = -local_8c0._28_4_;
      auVar304 = vsubps_avx(auVar303,auVar36);
      fVar334 = auVar304._0_4_ * fVar262;
      fVar343 = auVar304._4_4_ * fVar279;
      auVar55._4_4_ = fVar343;
      auVar55._0_4_ = fVar334;
      fVar309 = auVar304._8_4_ * fVar282;
      auVar55._8_4_ = fVar309;
      fVar312 = auVar304._12_4_ * fVar285;
      auVar55._12_4_ = fVar312;
      fVar315 = auVar304._16_4_ * fVar288;
      auVar55._16_4_ = fVar315;
      fVar318 = auVar304._20_4_ * fVar291;
      auVar55._20_4_ = fVar318;
      fVar321 = auVar304._24_4_ * fVar294;
      auVar55._24_4_ = fVar321;
      auVar55._28_4_ = auVar304._28_4_;
      auVar304 = vsubps_avx(auVar36,local_8c0);
      fVar262 = auVar304._0_4_ * fVar262;
      fVar279 = auVar304._4_4_ * fVar279;
      auVar56._4_4_ = fVar279;
      auVar56._0_4_ = fVar262;
      fVar282 = auVar304._8_4_ * fVar282;
      auVar56._8_4_ = fVar282;
      fVar285 = auVar304._12_4_ * fVar285;
      auVar56._12_4_ = fVar285;
      fVar288 = auVar304._16_4_ * fVar288;
      auVar56._16_4_ = fVar288;
      fVar291 = auVar304._20_4_ * fVar291;
      auVar56._20_4_ = fVar291;
      fVar294 = auVar304._24_4_ * fVar294;
      auVar56._24_4_ = fVar294;
      auVar56._28_4_ = auVar304._28_4_;
      local_580 = local_320 * (fVar296 + local_460 * fVar334);
      fStack_57c = fStack_31c * (fVar306 + fStack_45c * fVar343);
      fStack_578 = fStack_318 * (fVar308 + fStack_458 * fVar309);
      fStack_574 = fStack_314 * (fVar311 + fStack_454 * fVar312);
      fStack_570 = fStack_310 * (fVar314 + fStack_450 * fVar315);
      fStack_56c = fStack_30c * (fVar317 + fStack_44c * fVar318);
      fStack_568 = fStack_308 * (fVar320 + fStack_448 * fVar321);
      fStack_564 = local_8c0._28_4_;
      auVar338._8_4_ = 0x7fffffff;
      auVar338._0_8_ = 0x7fffffff7fffffff;
      auVar338._12_4_ = 0x7fffffff;
      auVar338._16_4_ = 0x7fffffff;
      auVar338._20_4_ = 0x7fffffff;
      auVar338._24_4_ = 0x7fffffff;
      auVar338._28_4_ = 0x7fffffff;
      auVar304 = vandps_avx(local_340,auVar338);
      auVar304 = vmaxps_avx(local_420,auVar304);
      auVar57._4_4_ = auVar304._4_4_ * 1.9073486e-06;
      auVar57._0_4_ = auVar304._0_4_ * 1.9073486e-06;
      auVar57._8_4_ = auVar304._8_4_ * 1.9073486e-06;
      auVar57._12_4_ = auVar304._12_4_ * 1.9073486e-06;
      auVar57._16_4_ = auVar304._16_4_ * 1.9073486e-06;
      auVar57._20_4_ = auVar304._20_4_ * 1.9073486e-06;
      auVar57._24_4_ = auVar304._24_4_ * 1.9073486e-06;
      auVar57._28_4_ = auVar304._28_4_;
      auVar304 = vandps_avx(local_440,auVar338);
      auVar304 = vcmpps_avx(auVar304,auVar57,1);
      auVar339._8_4_ = 0x7f800000;
      auVar339._0_8_ = 0x7f8000007f800000;
      auVar339._12_4_ = 0x7f800000;
      auVar339._16_4_ = 0x7f800000;
      auVar339._20_4_ = 0x7f800000;
      auVar339._24_4_ = 0x7f800000;
      auVar339._28_4_ = 0x7f800000;
      auVar114 = vblendvps_avx(auVar339,auVar55,auVar18);
      local_5c0._4_4_ = fStack_31c * (fVar306 + fStack_45c * fVar279);
      local_5c0._0_4_ = local_320 * (fVar296 + local_460 * fVar262);
      fStack_5b8 = fStack_318 * (fVar308 + fStack_458 * fVar282);
      fStack_5b4 = fStack_314 * (fVar311 + fStack_454 * fVar285);
      fStack_5b0 = fStack_310 * (fVar314 + fStack_450 * fVar288);
      fStack_5ac = fStack_30c * (fVar317 + fStack_44c * fVar291);
      fStack_5a8 = fStack_308 * (fVar320 + fStack_448 * fVar294);
      uStack_5a4 = auVar114._28_4_;
      auVar271._8_4_ = 0xff800000;
      auVar271._0_8_ = 0xff800000ff800000;
      auVar271._12_4_ = 0xff800000;
      auVar271._16_4_ = 0xff800000;
      auVar271._20_4_ = 0xff800000;
      auVar271._24_4_ = 0xff800000;
      auVar271._28_4_ = 0xff800000;
      auVar385 = vblendvps_avx(auVar271,auVar56,auVar18);
      auVar36 = auVar18 & auVar304;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0x7f,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0xbf,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar36[0x1f] < '\0') {
        auVar111 = vandps_avx(auVar304,auVar18);
        auVar238 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar304 = vcmpps_avx(auVar268,ZEXT832(0) << 0x20,2);
        auVar389._8_4_ = 0xff800000;
        auVar389._0_8_ = 0xff800000ff800000;
        auVar389._12_4_ = 0xff800000;
        auVar389._16_4_ = 0xff800000;
        auVar389._20_4_ = 0xff800000;
        auVar389._24_4_ = 0xff800000;
        auVar389._28_4_ = 0xff800000;
        auVar374._8_4_ = 0x7f800000;
        auVar374._0_8_ = 0x7f8000007f800000;
        auVar374._12_4_ = 0x7f800000;
        auVar374._16_4_ = 0x7f800000;
        auVar374._20_4_ = 0x7f800000;
        auVar374._24_4_ = 0x7f800000;
        auVar374._28_4_ = 0x7f800000;
        auVar268 = vblendvps_avx(auVar374,auVar389,auVar304);
        auVar138 = vpmovsxwd_avx(auVar238);
        auVar238 = vpunpckhwd_avx(auVar238,auVar238);
        auVar249._16_16_ = auVar238;
        auVar249._0_16_ = auVar138;
        auVar114 = vblendvps_avx(auVar114,auVar268,auVar249);
        auVar268 = vblendvps_avx(auVar389,auVar374,auVar304);
        auVar385 = vblendvps_avx(auVar385,auVar268,auVar249);
        auVar268 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar121._0_4_ = auVar111._0_4_ ^ auVar268._0_4_;
        auVar121._4_4_ = auVar111._4_4_ ^ auVar268._4_4_;
        auVar121._8_4_ = auVar111._8_4_ ^ auVar268._8_4_;
        auVar121._12_4_ = auVar111._12_4_ ^ auVar268._12_4_;
        auVar121._16_4_ = auVar111._16_4_ ^ auVar268._16_4_;
        auVar121._20_4_ = auVar111._20_4_ ^ auVar268._20_4_;
        auVar121._24_4_ = auVar111._24_4_ ^ auVar268._24_4_;
        auVar121._28_4_ = auVar111._28_4_ ^ auVar268._28_4_;
        auVar111 = vorps_avx(auVar304,auVar121);
        auVar111 = vandps_avx(auVar18,auVar111);
      }
    }
    auVar391 = ZEXT3264(local_a20);
    auVar268 = local_3e0 & auVar111;
    auVar276 = ZEXT3264(local_9a0);
    if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar268 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar268 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar268 >> 0x7f,0) == '\0') &&
          (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar268 >> 0xbf,0) == '\0') &&
        (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar268[0x1f])
    {
      auVar329 = ZEXT3264(local_9c0);
      auVar348 = ZEXT3264(local_980);
      auVar388 = ZEXT3264(local_940);
    }
    else {
      fStack_444 = fStack_724 + fStack_744 + 0.0;
      fStack_304 = auVar112._28_4_ + auVar170._28_4_;
      auVar138 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_560._0_16_ = auVar138;
      auVar238 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_));
      auVar238 = vshufps_avx(auVar238,auVar238,0);
      auVar244._16_16_ = auVar238;
      auVar244._0_16_ = auVar238;
      auVar304 = vminps_avx(auVar244,auVar385);
      fVar291 = auVar38._28_4_;
      auVar152._0_4_ =
           (float)local_740._0_4_ * fVar261 +
           (float)local_760._0_4_ * fVar295 + fVar356 * (float)local_720._0_4_;
      auVar152._4_4_ =
           (float)local_740._4_4_ * fVar278 +
           (float)local_760._4_4_ * fVar305 + fVar359 * (float)local_720._4_4_;
      auVar152._8_4_ = fStack_738 * fVar281 + fStack_758 * fVar307 + fVar360 * fStack_718;
      auVar152._12_4_ = fStack_734 * fVar284 + fStack_754 * fVar310 + fVar362 * fStack_714;
      auVar152._16_4_ = fStack_730 * fVar287 + fStack_750 * fVar313 + fVar363 * fStack_710;
      auVar152._20_4_ = fStack_72c * fVar290 + fStack_74c * fVar316 + fVar364 * fStack_70c;
      auVar152._24_4_ = fStack_728 * fVar293 + fStack_748 * fVar319 + fVar365 * fStack_708;
      auVar152._28_4_ = fVar291 + auVar302._28_4_ + fVar291;
      auVar268 = vrcpps_avx(auVar152);
      fVar334 = auVar268._0_4_;
      fVar343 = auVar268._4_4_;
      auVar58._4_4_ = auVar152._4_4_ * fVar343;
      auVar58._0_4_ = auVar152._0_4_ * fVar334;
      fVar262 = auVar268._8_4_;
      auVar58._8_4_ = auVar152._8_4_ * fVar262;
      fVar279 = auVar268._12_4_;
      auVar58._12_4_ = auVar152._12_4_ * fVar279;
      fVar282 = auVar268._16_4_;
      auVar58._16_4_ = auVar152._16_4_ * fVar282;
      fVar285 = auVar268._20_4_;
      auVar58._20_4_ = auVar152._20_4_ * fVar285;
      fVar288 = auVar268._24_4_;
      auVar58._24_4_ = auVar152._24_4_ * fVar288;
      auVar58._28_4_ = auVar39._28_4_;
      auVar372._8_4_ = 0x3f800000;
      auVar372._0_8_ = 0x3f8000003f800000;
      auVar372._12_4_ = 0x3f800000;
      auVar372._16_4_ = 0x3f800000;
      auVar372._20_4_ = 0x3f800000;
      auVar372._24_4_ = 0x3f800000;
      auVar372._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar372,auVar58);
      auVar332._8_4_ = 0x7fffffff;
      auVar332._0_8_ = 0x7fffffff7fffffff;
      auVar332._12_4_ = 0x7fffffff;
      auVar332._16_4_ = 0x7fffffff;
      auVar332._20_4_ = 0x7fffffff;
      auVar332._24_4_ = 0x7fffffff;
      auVar332._28_4_ = 0x7fffffff;
      auVar268 = vandps_avx(auVar332,auVar152);
      auVar373._8_4_ = 0x219392ef;
      auVar373._0_8_ = 0x219392ef219392ef;
      auVar373._12_4_ = 0x219392ef;
      auVar373._16_4_ = 0x219392ef;
      auVar373._20_4_ = 0x219392ef;
      auVar373._24_4_ = 0x219392ef;
      auVar373._28_4_ = 0x219392ef;
      auVar112 = vcmpps_avx(auVar268,auVar373,1);
      auVar59._4_4_ =
           (fVar343 + fVar343 * auVar38._4_4_) *
           -(fVar254 * fVar278 + fVar252 * fVar305 + fVar250 * fVar359);
      auVar59._0_4_ =
           (fVar334 + fVar334 * auVar38._0_4_) *
           -(fVar206 * fVar261 + fVar203 * fVar295 + fVar202 * fVar356);
      auVar59._8_4_ =
           (fVar262 + fVar262 * auVar38._8_4_) *
           -(fVar232 * fVar281 + fVar231 * fVar307 + fVar229 * fVar360);
      auVar59._12_4_ =
           (fVar279 + fVar279 * auVar38._12_4_) *
           -(fVar256 * fVar284 + fVar255 * fVar310 + fVar253 * fVar362);
      auVar59._16_4_ =
           (fVar282 + fVar282 * auVar38._16_4_) *
           -(fVar286 * fVar287 + fVar283 * fVar313 + fVar280 * fVar363);
      auVar59._20_4_ =
           (fVar285 + fVar285 * auVar38._20_4_) *
           -(fVar22 * fVar290 + fVar21 * fVar316 + fVar20 * fVar364);
      auVar59._24_4_ =
           (fVar288 + fVar288 * auVar38._24_4_) *
           -(fVar29 * fVar293 + fVar28 * fVar319 + fVar27 * fVar365);
      auVar59._28_4_ = -(fVar291 + auVar37._28_4_ + fVar291);
      auVar268 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,1);
      auVar268 = vorps_avx(auVar112,auVar268);
      auVar347._8_4_ = 0xff800000;
      auVar347._0_8_ = 0xff800000ff800000;
      auVar347._12_4_ = 0xff800000;
      auVar347._16_4_ = 0xff800000;
      auVar347._20_4_ = 0xff800000;
      auVar347._24_4_ = 0xff800000;
      auVar347._28_4_ = 0xff800000;
      auVar268 = vblendvps_avx(auVar59,auVar347,auVar268);
      auVar37 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,6);
      auVar112 = vorps_avx(auVar112,auVar37);
      auVar386._8_4_ = 0x7f800000;
      auVar386._0_8_ = 0x7f8000007f800000;
      auVar386._12_4_ = 0x7f800000;
      auVar386._16_4_ = 0x7f800000;
      auVar386._20_4_ = 0x7f800000;
      auVar386._24_4_ = 0x7f800000;
      auVar386._28_4_ = 0x7f800000;
      auVar112 = vblendvps_avx(auVar59,auVar386,auVar112);
      auVar37 = vmaxps_avx(local_300,auVar114);
      auVar37 = vmaxps_avx(auVar37,auVar268);
      auVar38 = vminps_avx(auVar304,auVar112);
      auVar304 = ZEXT832(0) << 0x20;
      auVar268 = vsubps_avx(auVar304,auVar151);
      auVar112 = vsubps_avx(auVar304,local_9e0);
      auVar60._4_4_ = auVar112._4_4_ * -fVar376;
      auVar60._0_4_ = auVar112._0_4_ * -fVar367;
      auVar60._8_4_ = auVar112._8_4_ * -fVar377;
      auVar60._12_4_ = auVar112._12_4_ * -fVar378;
      auVar60._16_4_ = auVar112._16_4_ * -fVar379;
      auVar60._20_4_ = auVar112._20_4_ * -fVar380;
      auVar60._24_4_ = auVar112._24_4_ * -fVar381;
      auVar60._28_4_ = auVar112._28_4_;
      auVar61._4_4_ = fVar230 * auVar268._4_4_;
      auVar61._0_4_ = fVar179 * auVar268._0_4_;
      auVar61._8_4_ = fVar207 * auVar268._8_4_;
      auVar61._12_4_ = fVar236 * auVar268._12_4_;
      auVar61._16_4_ = fVar260 * auVar268._16_4_;
      auVar61._20_4_ = fVar355 * auVar268._20_4_;
      auVar61._24_4_ = fVar25 * auVar268._24_4_;
      auVar61._28_4_ = auVar268._28_4_;
      auVar268 = vsubps_avx(auVar60,auVar61);
      auVar112 = vsubps_avx(auVar304,auVar35);
      auVar62._4_4_ = fVar235 * auVar112._4_4_;
      auVar62._0_4_ = fVar201 * auVar112._0_4_;
      auVar62._8_4_ = fVar227 * auVar112._8_4_;
      auVar62._12_4_ = fVar251 * auVar112._12_4_;
      auVar62._16_4_ = fVar277 * auVar112._16_4_;
      auVar62._20_4_ = fVar366 * auVar112._20_4_;
      uVar9 = auVar112._28_4_;
      auVar62._24_4_ = fVar26 * auVar112._24_4_;
      auVar62._28_4_ = uVar9;
      auVar151 = vsubps_avx(auVar268,auVar62);
      auVar63._4_4_ = -fVar376 * (float)local_720._4_4_;
      auVar63._0_4_ = -fVar367 * (float)local_720._0_4_;
      auVar63._8_4_ = -fVar377 * fStack_718;
      auVar63._12_4_ = -fVar378 * fStack_714;
      auVar63._16_4_ = -fVar379 * fStack_710;
      auVar63._20_4_ = -fVar380 * fStack_70c;
      auVar63._24_4_ = -fVar381 * fStack_708;
      auVar63._28_4_ = uVar86 ^ 0x80000000;
      auVar64._4_4_ = (float)local_760._4_4_ * fVar230;
      auVar64._0_4_ = (float)local_760._0_4_ * fVar179;
      auVar64._8_4_ = fStack_758 * fVar207;
      auVar64._12_4_ = fStack_754 * fVar236;
      auVar64._16_4_ = fStack_750 * fVar260;
      auVar64._20_4_ = fStack_74c * fVar355;
      auVar64._24_4_ = fStack_748 * fVar25;
      auVar64._28_4_ = uVar9;
      auVar340._8_4_ = 0x3f800000;
      auVar340._0_8_ = 0x3f8000003f800000;
      auVar340._12_4_ = 0x3f800000;
      auVar340._16_4_ = 0x3f800000;
      auVar340._20_4_ = 0x3f800000;
      auVar340._24_4_ = 0x3f800000;
      auVar340._28_4_ = 0x3f800000;
      auVar268 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = (float)local_740._4_4_ * fVar235;
      auVar65._0_4_ = (float)local_740._0_4_ * fVar201;
      auVar65._8_4_ = fStack_738 * fVar227;
      auVar65._12_4_ = fStack_734 * fVar251;
      auVar65._16_4_ = fStack_730 * fVar277;
      auVar65._20_4_ = fStack_72c * fVar366;
      auVar65._24_4_ = fStack_728 * fVar26;
      auVar65._28_4_ = uVar9;
      auVar35 = vsubps_avx(auVar268,auVar65);
      auVar268 = vrcpps_avx(auVar35);
      fVar179 = auVar268._0_4_;
      fVar201 = auVar268._4_4_;
      auVar66._4_4_ = auVar35._4_4_ * fVar201;
      auVar66._0_4_ = auVar35._0_4_ * fVar179;
      fVar202 = auVar268._8_4_;
      auVar66._8_4_ = auVar35._8_4_ * fVar202;
      fVar203 = auVar268._12_4_;
      auVar66._12_4_ = auVar35._12_4_ * fVar203;
      fVar206 = auVar268._16_4_;
      auVar66._16_4_ = auVar35._16_4_ * fVar206;
      fVar230 = auVar268._20_4_;
      auVar66._20_4_ = auVar35._20_4_ * fVar230;
      fVar235 = auVar268._24_4_;
      auVar66._24_4_ = auVar35._24_4_ * fVar235;
      auVar66._28_4_ = fStack_724;
      auVar39 = vsubps_avx(auVar340,auVar66);
      auVar268 = vandps_avx(auVar332,auVar35);
      auVar112 = vcmpps_avx(auVar268,auVar373,1);
      auVar67._4_4_ = (fVar201 + fVar201 * auVar39._4_4_) * -auVar151._4_4_;
      auVar67._0_4_ = (fVar179 + fVar179 * auVar39._0_4_) * -auVar151._0_4_;
      auVar67._8_4_ = (fVar202 + fVar202 * auVar39._8_4_) * -auVar151._8_4_;
      auVar67._12_4_ = (fVar203 + fVar203 * auVar39._12_4_) * -auVar151._12_4_;
      auVar67._16_4_ = (fVar206 + fVar206 * auVar39._16_4_) * -auVar151._16_4_;
      auVar67._20_4_ = (fVar230 + fVar230 * auVar39._20_4_) * -auVar151._20_4_;
      auVar67._24_4_ = (fVar235 + fVar235 * auVar39._24_4_) * -auVar151._24_4_;
      auVar67._28_4_ = auVar151._28_4_ ^ 0x80000000;
      auVar268 = vcmpps_avx(auVar35,auVar304,1);
      auVar268 = vorps_avx(auVar112,auVar268);
      auVar268 = vblendvps_avx(auVar67,auVar347,auVar268);
      _local_7e0 = vmaxps_avx(auVar37,auVar268);
      auVar268 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,6);
      auVar268 = vorps_avx(auVar112,auVar268);
      auVar268 = vblendvps_avx(auVar67,auVar386,auVar268);
      auVar111 = vandps_avx(auVar111,local_3e0);
      local_360 = vminps_avx(auVar38,auVar268);
      auVar268 = vcmpps_avx(_local_7e0,local_360,2);
      auVar112 = auVar111 & auVar268;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0x7f,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar112 >> 0xbf,0) != '\0') ||
          (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar112[0x1f] < '\0') {
        auVar112 = vminps_avx(local_700,auVar113);
        auVar151 = vminps_avx(auVar171,auVar375);
        auVar112 = vminps_avx(auVar112,auVar151);
        auVar112 = vsubps_avx(auVar112,local_4e0);
        auVar111 = vandps_avx(auVar268,auVar111);
        auVar81._4_4_ = fStack_57c;
        auVar81._0_4_ = local_580;
        auVar81._8_4_ = fStack_578;
        auVar81._12_4_ = fStack_574;
        auVar81._16_4_ = fStack_570;
        auVar81._20_4_ = fStack_56c;
        auVar81._24_4_ = fStack_568;
        auVar81._28_4_ = fStack_564;
        auVar268 = vminps_avx(auVar81,auVar340);
        auVar268 = vmaxps_avx(auVar268,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar93 + fVar133 * (auVar268._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar123 + fVar159 * (auVar268._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar125 + fVar160 * (auVar268._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar127 + fVar161 * (auVar268._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar93 + fVar133 * (auVar268._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar123 + fVar159 * (auVar268._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar125 + fVar160 * (auVar268._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar127 + auVar268._28_4_ + 7.0;
        auVar268 = vminps_avx(_local_5c0,auVar340);
        auVar268 = vmaxps_avx(auVar268,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar93 + fVar133 * (auVar268._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar123 + fVar159 * (auVar268._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar125 + fVar160 * (auVar268._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar127 + fVar161 * (auVar268._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar93 + fVar133 * (auVar268._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar123 + fVar159 * (auVar268._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar125 + fVar160 * (auVar268._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar127 + auVar268._28_4_ + 7.0;
        auVar68._4_4_ = auVar112._4_4_ * 0.99999976;
        auVar68._0_4_ = auVar112._0_4_ * 0.99999976;
        auVar68._8_4_ = auVar112._8_4_ * 0.99999976;
        auVar68._12_4_ = auVar112._12_4_ * 0.99999976;
        auVar68._16_4_ = auVar112._16_4_ * 0.99999976;
        auVar68._20_4_ = auVar112._20_4_ * 0.99999976;
        auVar68._24_4_ = auVar112._24_4_ * 0.99999976;
        auVar68._28_4_ = 0x3f7ffffc;
        auVar268 = vmaxps_avx(ZEXT832(0) << 0x20,auVar68);
        auVar69._4_4_ = auVar268._4_4_ * auVar268._4_4_;
        auVar69._0_4_ = auVar268._0_4_ * auVar268._0_4_;
        auVar69._8_4_ = auVar268._8_4_ * auVar268._8_4_;
        auVar69._12_4_ = auVar268._12_4_ * auVar268._12_4_;
        auVar69._16_4_ = auVar268._16_4_ * auVar268._16_4_;
        auVar69._20_4_ = auVar268._20_4_ * auVar268._20_4_;
        auVar69._24_4_ = auVar268._24_4_ * auVar268._24_4_;
        auVar69._28_4_ = auVar268._28_4_;
        local_860 = vsubps_avx(auVar40,auVar69);
        auVar70._4_4_ = local_860._4_4_ * (float)local_4c0._4_4_;
        auVar70._0_4_ = local_860._0_4_ * (float)local_4c0._0_4_;
        auVar70._8_4_ = local_860._8_4_ * fStack_4b8;
        auVar70._12_4_ = local_860._12_4_ * fStack_4b4;
        auVar70._16_4_ = local_860._16_4_ * fStack_4b0;
        auVar70._20_4_ = local_860._20_4_ * fStack_4ac;
        auVar70._24_4_ = local_860._24_4_ * fStack_4a8;
        auVar70._28_4_ = auVar268._28_4_;
        auVar112 = vsubps_avx(auVar52,auVar70);
        auVar268 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,5);
        if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar268 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar268 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar268 >> 0x7f,0) == '\0') &&
              (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar268 >> 0xbf,0) == '\0') &&
            (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar268[0x1f]) {
          auVar171 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_7a0 = ZEXT832(0) << 0x20;
          _local_7c0 = ZEXT832(0) << 0x20;
          auVar196 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar219 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          local_860 = auVar41;
          _local_780 = _local_7a0;
        }
        else {
          auVar171 = vsqrtps_avx(auVar112);
          auVar198._0_4_ = fVar124 + fVar124;
          auVar198._4_4_ = fVar126 + fVar126;
          auVar198._8_4_ = fVar128 + fVar128;
          auVar198._12_4_ = fVar129 + fVar129;
          auVar198._16_4_ = fVar130 + fVar130;
          auVar198._20_4_ = fVar131 + fVar131;
          auVar198._24_4_ = fVar333 + fVar333;
          auVar198._28_4_ = fVar259 + fVar259;
          auVar151 = vrcpps_avx(auVar198);
          fVar259 = auVar151._0_4_;
          fVar179 = auVar151._4_4_;
          auVar71._4_4_ = auVar198._4_4_ * fVar179;
          auVar71._0_4_ = auVar198._0_4_ * fVar259;
          fVar201 = auVar151._8_4_;
          auVar71._8_4_ = auVar198._8_4_ * fVar201;
          fVar202 = auVar151._12_4_;
          auVar71._12_4_ = auVar198._12_4_ * fVar202;
          fVar203 = auVar151._16_4_;
          auVar71._16_4_ = auVar198._16_4_ * fVar203;
          fVar206 = auVar151._20_4_;
          auVar71._20_4_ = auVar198._20_4_ * fVar206;
          fVar230 = auVar151._24_4_;
          auVar71._24_4_ = auVar198._24_4_ * fVar230;
          auVar71._28_4_ = auVar198._28_4_;
          auVar35 = vsubps_avx(auVar340,auVar71);
          fVar259 = fVar259 + fVar259 * auVar35._0_4_;
          fVar179 = fVar179 + fVar179 * auVar35._4_4_;
          fVar201 = fVar201 + fVar201 * auVar35._8_4_;
          fVar202 = fVar202 + fVar202 * auVar35._12_4_;
          fVar203 = fVar203 + fVar203 * auVar35._16_4_;
          fVar206 = fVar206 + fVar206 * auVar35._20_4_;
          fVar230 = fVar230 + fVar230 * auVar35._24_4_;
          fVar235 = auVar151._28_4_ + auVar35._28_4_;
          auVar222._0_8_ = local_8c0._0_8_ ^ 0x8000000080000000;
          auVar222._8_4_ = -local_8c0._8_4_;
          auVar222._12_4_ = -local_8c0._12_4_;
          auVar222._16_4_ = -local_8c0._16_4_;
          auVar222._20_4_ = -local_8c0._20_4_;
          auVar222._24_4_ = -local_8c0._24_4_;
          auVar222._28_4_ = -local_8c0._28_4_;
          auVar151 = vsubps_avx(auVar222,auVar171);
          fVar232 = auVar151._0_4_ * fVar259;
          fVar236 = auVar151._4_4_ * fVar179;
          auVar72._4_4_ = fVar236;
          auVar72._0_4_ = fVar232;
          fVar251 = auVar151._8_4_ * fVar201;
          auVar72._8_4_ = fVar251;
          fVar253 = auVar151._12_4_ * fVar202;
          auVar72._12_4_ = fVar253;
          fVar255 = auVar151._16_4_ * fVar203;
          auVar72._16_4_ = fVar255;
          fVar256 = auVar151._20_4_ * fVar206;
          auVar72._20_4_ = fVar256;
          fVar260 = auVar151._24_4_ * fVar230;
          auVar72._24_4_ = fVar260;
          auVar72._28_4_ = 0x219392ef;
          auVar171 = vsubps_avx(auVar171,local_8c0);
          fVar259 = auVar171._0_4_ * fVar259;
          fVar179 = auVar171._4_4_ * fVar179;
          auVar73._4_4_ = fVar179;
          auVar73._0_4_ = fVar259;
          fVar201 = auVar171._8_4_ * fVar201;
          auVar73._8_4_ = fVar201;
          fVar202 = auVar171._12_4_ * fVar202;
          auVar73._12_4_ = fVar202;
          fVar203 = auVar171._16_4_ * fVar203;
          auVar73._16_4_ = fVar203;
          fVar206 = auVar171._20_4_ * fVar206;
          auVar73._20_4_ = fVar206;
          fVar230 = auVar171._24_4_ * fVar230;
          auVar73._24_4_ = fVar230;
          auVar73._28_4_ = fVar361;
          fVar250 = local_320 * (fVar232 * local_460 + fVar296);
          fVar252 = fStack_31c * (fVar236 * fStack_45c + fVar306);
          fVar254 = fStack_318 * (fVar251 * fStack_458 + fVar308);
          fVar207 = fStack_314 * (fVar253 * fStack_454 + fVar311);
          fVar227 = fStack_310 * (fVar255 * fStack_450 + fVar314);
          fVar229 = fStack_30c * (fVar256 * fStack_44c + fVar317);
          fVar231 = fStack_308 * (fVar260 * fStack_448 + fVar320);
          auVar172._0_4_ = auVar369._0_4_ + fVar95 * fVar250;
          auVar172._4_4_ = auVar369._4_4_ + fVar228 * fVar252;
          auVar172._8_4_ = auVar369._8_4_ + fVar205 * fVar254;
          auVar172._12_4_ = auVar369._12_4_ + fVar234 * fVar207;
          auVar172._16_4_ = auVar369._16_4_ + fVar258 * fVar227;
          auVar172._20_4_ = auVar369._20_4_ + fVar292 * fVar229;
          auVar172._24_4_ = auVar369._24_4_ + fVar24 * fVar231;
          auVar172._28_4_ = auVar369._28_4_ + auVar171._28_4_ + fVar322;
          auVar74._4_4_ = fVar236 * (float)local_740._4_4_;
          auVar74._0_4_ = fVar232 * (float)local_740._0_4_;
          auVar74._8_4_ = fVar251 * fStack_738;
          auVar74._12_4_ = fVar253 * fStack_734;
          auVar74._16_4_ = fVar255 * fStack_730;
          auVar74._20_4_ = fVar256 * fStack_72c;
          auVar74._24_4_ = fVar260 * fStack_728;
          auVar74._28_4_ = fVar235;
          auVar171 = vsubps_avx(auVar74,auVar172);
          auVar199._0_4_ = auVar383._0_4_ + fVar94 * fVar250;
          auVar199._4_4_ = auVar383._4_4_ + fVar226 * fVar252;
          auVar199._8_4_ = auVar383._8_4_ + fVar204 * fVar254;
          auVar199._12_4_ = auVar383._12_4_ + fVar233 * fVar207;
          auVar199._16_4_ = auVar383._16_4_ + fVar257 * fVar227;
          auVar199._20_4_ = auVar383._20_4_ + fVar289 * fVar229;
          auVar199._24_4_ = auVar383._24_4_ + fVar23 * fVar231;
          auVar199._28_4_ = auVar383._28_4_ + fVar235;
          auVar246._0_4_ = (float)local_760._0_4_ * fVar232;
          auVar246._4_4_ = (float)local_760._4_4_ * fVar236;
          auVar246._8_4_ = fStack_758 * fVar251;
          auVar246._12_4_ = fStack_754 * fVar253;
          auVar246._16_4_ = fStack_750 * fVar255;
          auVar246._20_4_ = fStack_74c * fVar256;
          auVar246._24_4_ = fStack_748 * fVar260;
          auVar246._28_4_ = 0;
          _local_a00 = vsubps_avx(auVar246,auVar199);
          auVar223._0_4_ = (float)local_5a0._0_4_ + fVar344 * fVar250;
          auVar223._4_4_ = (float)local_5a0._4_4_ + fVar349 * fVar252;
          auVar223._8_4_ = fStack_598 + fVar350 * fVar254;
          auVar223._12_4_ = fStack_594 + fVar351 * fVar207;
          auVar223._16_4_ = fStack_590 + fVar352 * fVar227;
          auVar223._20_4_ = fStack_58c + fVar353 * fVar229;
          auVar223._24_4_ = fStack_588 + fVar354 * fVar231;
          auVar223._28_4_ = fStack_584 + auVar151._28_4_;
          auVar75._4_4_ = (float)local_720._4_4_ * fVar236;
          auVar75._0_4_ = (float)local_720._0_4_ * fVar232;
          auVar75._8_4_ = fStack_718 * fVar251;
          auVar75._12_4_ = fStack_714 * fVar253;
          auVar75._16_4_ = fStack_710 * fVar255;
          auVar75._20_4_ = fStack_70c * fVar256;
          auVar75._24_4_ = fStack_708 * fVar260;
          auVar75._28_4_ = 0;
          auVar151 = vsubps_avx(auVar75,auVar223);
          auVar219 = auVar151._0_28_;
          fVar235 = local_320 * (fVar259 * local_460 + fVar296);
          fVar250 = fStack_31c * (fVar179 * fStack_45c + fVar306);
          fVar252 = fStack_318 * (fVar201 * fStack_458 + fVar308);
          fVar254 = fStack_314 * (fVar202 * fStack_454 + fVar311);
          fVar207 = fStack_310 * (fVar203 * fStack_450 + fVar314);
          fVar227 = fStack_30c * (fVar206 * fStack_44c + fVar317);
          fVar229 = fStack_308 * (fVar230 * fStack_448 + fVar320);
          auVar273._0_4_ = auVar369._0_4_ + fVar95 * fVar235;
          auVar273._4_4_ = auVar369._4_4_ + fVar228 * fVar250;
          auVar273._8_4_ = auVar369._8_4_ + fVar205 * fVar252;
          auVar273._12_4_ = auVar369._12_4_ + fVar234 * fVar254;
          auVar273._16_4_ = auVar369._16_4_ + fVar258 * fVar207;
          auVar273._20_4_ = auVar369._20_4_ + fVar292 * fVar227;
          auVar273._24_4_ = auVar369._24_4_ + fVar24 * fVar229;
          auVar273._28_4_ = auVar369._28_4_ + (float)local_540._28_4_;
          auVar76._4_4_ = fVar179 * (float)local_740._4_4_;
          auVar76._0_4_ = fVar259 * (float)local_740._0_4_;
          auVar76._8_4_ = fVar201 * fStack_738;
          auVar76._12_4_ = fVar202 * fStack_734;
          auVar76._16_4_ = fVar203 * fStack_730;
          auVar76._20_4_ = fVar206 * fStack_72c;
          auVar76._24_4_ = fVar230 * fStack_728;
          auVar76._28_4_ = fStack_724;
          _local_780 = vsubps_avx(auVar76,auVar273);
          auVar274._0_4_ = auVar383._0_4_ + fVar94 * fVar235;
          auVar274._4_4_ = auVar383._4_4_ + fVar226 * fVar250;
          auVar274._8_4_ = auVar383._8_4_ + fVar204 * fVar252;
          auVar274._12_4_ = auVar383._12_4_ + fVar233 * fVar254;
          auVar274._16_4_ = auVar383._16_4_ + fVar257 * fVar207;
          auVar274._20_4_ = auVar383._20_4_ + fVar289 * fVar227;
          auVar274._24_4_ = auVar383._24_4_ + fVar23 * fVar229;
          auVar274._28_4_ = auVar383._28_4_ + local_780._28_4_;
          auVar77._4_4_ = (float)local_760._4_4_ * fVar179;
          auVar77._0_4_ = (float)local_760._0_4_ * fVar259;
          auVar77._8_4_ = fStack_758 * fVar201;
          auVar77._12_4_ = fStack_754 * fVar202;
          auVar77._16_4_ = fStack_750 * fVar203;
          auVar77._20_4_ = fStack_74c * fVar206;
          auVar77._24_4_ = fStack_748 * fVar230;
          auVar77._28_4_ = fStack_724;
          _local_7a0 = vsubps_avx(auVar77,auVar274);
          auVar247._0_4_ = (float)local_5a0._0_4_ + fVar344 * fVar235;
          auVar247._4_4_ = (float)local_5a0._4_4_ + fVar349 * fVar250;
          auVar247._8_4_ = fStack_598 + fVar350 * fVar252;
          auVar247._12_4_ = fStack_594 + fVar351 * fVar254;
          auVar247._16_4_ = fStack_590 + fVar352 * fVar207;
          auVar247._20_4_ = fStack_58c + fVar353 * fVar227;
          auVar247._24_4_ = fStack_588 + fVar354 * fVar229;
          auVar247._28_4_ = fStack_584 + fVar322 + 0.0;
          auVar78._4_4_ = (float)local_720._4_4_ * fVar179;
          auVar78._0_4_ = (float)local_720._0_4_ * fVar259;
          auVar78._8_4_ = fStack_718 * fVar201;
          auVar78._12_4_ = fStack_714 * fVar202;
          auVar78._16_4_ = fStack_710 * fVar203;
          auVar78._20_4_ = fStack_70c * fVar206;
          auVar78._24_4_ = fStack_708 * fVar230;
          auVar78._28_4_ = local_7a0._28_4_;
          _local_7c0 = vsubps_avx(auVar78,auVar247);
          auVar151 = vcmpps_avx(auVar112,_DAT_01faff00,5);
          auVar248._8_4_ = 0x7f800000;
          auVar248._0_8_ = 0x7f8000007f800000;
          auVar248._12_4_ = 0x7f800000;
          auVar248._16_4_ = 0x7f800000;
          auVar248._20_4_ = 0x7f800000;
          auVar248._24_4_ = 0x7f800000;
          auVar248._28_4_ = 0x7f800000;
          auVar245 = vblendvps_avx(auVar248,auVar72,auVar151);
          auVar341._8_4_ = 0x7fffffff;
          auVar341._0_8_ = 0x7fffffff7fffffff;
          auVar341._12_4_ = 0x7fffffff;
          auVar341._16_4_ = 0x7fffffff;
          auVar341._20_4_ = 0x7fffffff;
          auVar341._24_4_ = 0x7fffffff;
          auVar341._28_4_ = 0x7fffffff;
          auVar112 = vandps_avx(auVar341,local_340);
          auVar112 = vmaxps_avx(local_420,auVar112);
          auVar79._4_4_ = auVar112._4_4_ * 1.9073486e-06;
          auVar79._0_4_ = auVar112._0_4_ * 1.9073486e-06;
          auVar79._8_4_ = auVar112._8_4_ * 1.9073486e-06;
          auVar79._12_4_ = auVar112._12_4_ * 1.9073486e-06;
          auVar79._16_4_ = auVar112._16_4_ * 1.9073486e-06;
          auVar79._20_4_ = auVar112._20_4_ * 1.9073486e-06;
          auVar79._24_4_ = auVar112._24_4_ * 1.9073486e-06;
          auVar79._28_4_ = auVar112._28_4_;
          auVar112 = vandps_avx(auVar341,local_440);
          auVar112 = vcmpps_avx(auVar112,auVar79,1);
          auVar275._8_4_ = 0xff800000;
          auVar275._0_8_ = 0xff800000ff800000;
          auVar275._12_4_ = 0xff800000;
          auVar275._16_4_ = 0xff800000;
          auVar275._20_4_ = 0xff800000;
          auVar275._24_4_ = 0xff800000;
          auVar275._28_4_ = 0xff800000;
          auVar272 = vblendvps_avx(auVar275,auVar73,auVar151);
          auVar35 = auVar151 & auVar112;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            auVar268 = vandps_avx(auVar112,auVar151);
            auVar238 = vpackssdw_avx(auVar268._0_16_,auVar268._16_16_);
            auVar375 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar35 = vcmpps_avx(local_860,auVar375,2);
            auVar387._8_4_ = 0xff800000;
            auVar387._0_8_ = 0xff800000ff800000;
            auVar387._12_4_ = 0xff800000;
            auVar387._16_4_ = 0xff800000;
            auVar387._20_4_ = 0xff800000;
            auVar387._24_4_ = 0xff800000;
            auVar387._28_4_ = 0xff800000;
            auVar390._8_4_ = 0x7f800000;
            auVar390._0_8_ = 0x7f8000007f800000;
            auVar390._12_4_ = 0x7f800000;
            auVar390._16_4_ = 0x7f800000;
            auVar390._20_4_ = 0x7f800000;
            auVar390._24_4_ = 0x7f800000;
            auVar390._28_4_ = 0x7f800000;
            auVar112 = vblendvps_avx(auVar390,auVar387,auVar35);
            auVar189 = vpmovsxwd_avx(auVar238);
            auVar238 = vpunpckhwd_avx(auVar238,auVar238);
            auVar342._16_16_ = auVar238;
            auVar342._0_16_ = auVar189;
            auVar245 = vblendvps_avx(auVar245,auVar112,auVar342);
            auVar112 = vblendvps_avx(auVar387,auVar390,auVar35);
            auVar272 = vblendvps_avx(auVar272,auVar112,auVar342);
            auVar112 = vcmpps_avx(auVar375,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar122._0_4_ = auVar112._0_4_ ^ auVar268._0_4_;
            auVar122._4_4_ = auVar112._4_4_ ^ auVar268._4_4_;
            auVar122._8_4_ = auVar112._8_4_ ^ auVar268._8_4_;
            auVar122._12_4_ = auVar112._12_4_ ^ auVar268._12_4_;
            auVar122._16_4_ = auVar112._16_4_ ^ auVar268._16_4_;
            auVar122._20_4_ = auVar112._20_4_ ^ auVar268._20_4_;
            auVar122._24_4_ = auVar112._24_4_ ^ auVar268._24_4_;
            auVar122._28_4_ = auVar112._28_4_ ^ auVar268._28_4_;
            auVar268 = vorps_avx(auVar35,auVar122);
            auVar268 = vandps_avx(auVar151,auVar268);
          }
          auVar196 = local_a00._0_28_;
          local_9e0 = auVar171;
        }
        auVar388 = ZEXT3264(local_940);
        _local_3c0 = _local_7e0;
        local_3a0 = vminps_avx(local_360,auVar245);
        local_380 = vmaxps_avx(_local_7e0,auVar272);
        auVar112 = vcmpps_avx(_local_7e0,local_3a0,2);
        _local_4c0 = vandps_avx(auVar111,auVar112);
        auVar112 = vcmpps_avx(local_380,local_360,2);
        local_500 = vandps_avx(auVar111,auVar112);
        auVar111 = vorps_avx(local_500,_local_4c0);
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0x7f,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0xbf,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar111[0x1f] < '\0') {
          _local_5a0 = local_380;
          auVar112 = _local_5a0;
          _local_5c0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_520._0_4_ = auVar268._0_4_ ^ local_5c0._0_4_;
          local_520._4_4_ = auVar268._4_4_ ^ local_5c0._4_4_;
          local_520._8_4_ = auVar268._8_4_ ^ local_5c0._8_4_;
          local_520._12_4_ = auVar268._12_4_ ^ local_5c0._12_4_;
          local_520._16_4_ = auVar268._16_4_ ^ local_5c0._16_4_;
          local_520._20_4_ = auVar268._20_4_ ^ local_5c0._20_4_;
          local_520._24_4_ = auVar268._24_4_ ^ local_5c0._24_4_;
          local_520._28_4_ = (uint)auVar268._28_4_ ^ (uint)local_5c0._28_4_;
          auVar117._0_4_ =
               auVar171._0_4_ * (float)local_740._0_4_ +
               auVar196._0_4_ * (float)local_760._0_4_ + (float)local_720._0_4_ * auVar219._0_4_;
          auVar117._4_4_ =
               auVar171._4_4_ * (float)local_740._4_4_ +
               auVar196._4_4_ * (float)local_760._4_4_ + (float)local_720._4_4_ * auVar219._4_4_;
          auVar117._8_4_ =
               auVar171._8_4_ * fStack_738 +
               auVar196._8_4_ * fStack_758 + fStack_718 * auVar219._8_4_;
          auVar117._12_4_ =
               auVar171._12_4_ * fStack_734 +
               auVar196._12_4_ * fStack_754 + fStack_714 * auVar219._12_4_;
          auVar117._16_4_ =
               auVar171._16_4_ * fStack_730 +
               auVar196._16_4_ * fStack_750 + fStack_710 * auVar219._16_4_;
          auVar117._20_4_ =
               auVar171._20_4_ * fStack_72c +
               auVar196._20_4_ * fStack_74c + fStack_70c * auVar219._20_4_;
          auVar117._24_4_ =
               auVar171._24_4_ * fStack_728 +
               auVar196._24_4_ * fStack_748 + fStack_708 * auVar219._24_4_;
          auVar117._28_4_ = auVar268._28_4_ + local_5c0._28_4_ + auVar171._28_4_;
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar117,auVar154);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar155,1);
          auVar111 = vorps_avx(auVar111,local_520);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar173,auVar156,auVar111);
          local_540 = ZEXT432(local_c08);
          auVar189 = vpshufd_avx(ZEXT416(local_c08),0);
          auVar238 = vpcmpgtd_avx(auVar111._16_16_,auVar189);
          local_580 = auVar189._0_4_;
          fStack_57c = auVar189._4_4_;
          fStack_578 = auVar189._8_4_;
          fStack_574 = auVar189._12_4_;
          auVar189 = vpcmpgtd_avx(auVar111._0_16_,auVar189);
          auVar157._16_16_ = auVar238;
          auVar157._0_16_ = auVar189;
          local_4e0 = vblendps_avx(ZEXT1632(auVar189),auVar157,0xf0);
          local_4a0 = vandnps_avx(local_4e0,_local_4c0);
          auVar348 = ZEXT3264(local_4a0);
          auVar111 = _local_4c0 & ~local_4e0;
          auVar329 = ZEXT3264(local_9c0);
          auVar276 = ZEXT3264(local_9a0);
          local_a80 = auVar33._0_4_;
          fStack_a7c = auVar33._4_4_;
          fStack_a78 = auVar33._8_4_;
          fStack_a74 = auVar33._12_4_;
          local_a60 = auVar31._0_4_;
          fStack_a5c = auVar31._4_4_;
          fStack_a58 = auVar31._8_4_;
          fStack_a54 = auVar31._12_4_;
          local_a70 = auVar32._0_4_;
          fStack_a6c = auVar32._4_4_;
          fStack_a68 = auVar32._8_4_;
          fStack_a64 = auVar32._12_4_;
          local_a90 = auVar34._0_4_;
          fStack_a8c = auVar34._4_4_;
          fStack_a88 = auVar34._8_4_;
          fStack_a84 = auVar34._12_4_;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) {
            auVar238 = vshufps_avx(auVar138,auVar138,0);
            auVar118._16_16_ = auVar238;
            auVar118._0_16_ = auVar238;
            local_5a0._0_4_ = local_380._0_4_;
            local_5a0._4_4_ = local_380._4_4_;
            fStack_598 = local_380._8_4_;
            fStack_594 = local_380._12_4_;
            fStack_590 = local_380._16_4_;
            fStack_58c = local_380._20_4_;
            fStack_588 = local_380._24_4_;
            fStack_584 = local_380._28_4_;
            auVar219 = local_740._0_28_;
            fVar259 = (float)local_5a0._0_4_;
            fVar94 = (float)local_5a0._4_4_;
            fVar95 = fStack_598;
            fVar179 = fStack_594;
            fVar201 = fStack_590;
            fVar202 = fStack_58c;
            fVar203 = fStack_588;
            fVar206 = fStack_584;
            _local_5a0 = auVar112;
          }
          else {
            local_8e0._4_4_ = (float)local_7e0._4_4_ + local_880._4_4_;
            local_8e0._0_4_ = (float)local_7e0._0_4_ + (float)local_880;
            fStack_8d8 = fStack_7d8 + (float)uStack_878;
            fStack_8d4 = fStack_7d4 + uStack_878._4_4_;
            fStack_8d0 = fStack_7d0 + (float)uStack_870;
            fStack_8cc = fStack_7cc + uStack_870._4_4_;
            fStack_8c8 = fStack_7c8 + (float)uStack_868;
            fStack_8c4 = fStack_7c4 + uStack_868._4_4_;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar111 = auVar348._0_32_;
              auVar268 = vblendvps_avx(auVar119,_local_7e0,auVar111);
              auVar112 = vshufps_avx(auVar268,auVar268,0xb1);
              auVar112 = vminps_avx(auVar268,auVar112);
              auVar151 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar151);
              auVar151 = vperm2f128_avx(auVar112,auVar112,1);
              auVar112 = vminps_avx(auVar112,auVar151);
              auVar268 = vcmpps_avx(auVar268,auVar112,0);
              auVar112 = auVar111 & auVar268;
              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar112 >> 0x7f,0) != '\0') ||
                    (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar112 >> 0xbf,0) != '\0') ||
                  (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar112[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar268,auVar111);
              }
              uVar83 = vmovmskps_avx(auVar111);
              uVar86 = 0;
              if (uVar83 != 0) {
                for (; (uVar83 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
                }
              }
              uVar85 = (ulong)uVar86;
              *(undefined4 *)(local_4a0 + uVar85 * 4) = 0;
              fVar259 = local_1a0[uVar85];
              uVar86 = *(uint *)(local_3c0 + uVar85 * 4);
              fVar94 = auVar30._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar94 = sqrtf((float)local_900._0_4_);
              }
              auVar138 = vminps_avx(auVar31,auVar33);
              auVar238 = vmaxps_avx(auVar31,auVar33);
              auVar189 = vminps_avx(auVar32,auVar34);
              auVar106 = vminps_avx(auVar138,auVar189);
              auVar138 = vmaxps_avx(auVar32,auVar34);
              auVar189 = vmaxps_avx(auVar238,auVar138);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar238 = vandps_avx(auVar106,auVar183);
              auVar138 = vandps_avx(auVar189,auVar183);
              auVar238 = vmaxps_avx(auVar238,auVar138);
              auVar138 = vmovshdup_avx(auVar238);
              auVar138 = vmaxss_avx(auVar138,auVar238);
              auVar238 = vshufpd_avx(auVar238,auVar238,1);
              auVar238 = vmaxss_avx(auVar238,auVar138);
              local_9e0._0_4_ = auVar238._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar94 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
              auVar238 = vinsertps_avx(ZEXT416(uVar86),ZEXT416((uint)fVar259),0x10);
              lVar92 = 5;
              do {
                auVar138 = vmovshdup_avx(auVar238);
                fVar252 = auVar138._0_4_;
                fVar201 = 1.0 - fVar252;
                auVar138 = vshufps_avx(auVar238,auVar238,0x55);
                fVar259 = auVar138._0_4_;
                fVar94 = auVar138._4_4_;
                fVar95 = auVar138._8_4_;
                fVar179 = auVar138._12_4_;
                auVar138 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                fVar202 = auVar138._0_4_;
                fVar203 = auVar138._4_4_;
                fVar206 = auVar138._8_4_;
                fVar226 = auVar138._12_4_;
                fVar228 = local_a70 * fVar259 + local_a80 * fVar202;
                fVar230 = fStack_a6c * fVar94 + fStack_a7c * fVar203;
                fVar235 = fStack_a68 * fVar95 + fStack_a78 * fVar206;
                fVar250 = fStack_a64 * fVar179 + fStack_a74 * fVar226;
                auVar239._0_4_ =
                     fVar202 * (local_a80 * fVar259 + fVar202 * local_a60) + fVar259 * fVar228;
                auVar239._4_4_ =
                     fVar203 * (fStack_a7c * fVar94 + fVar203 * fStack_a5c) + fVar94 * fVar230;
                auVar239._8_4_ =
                     fVar206 * (fStack_a78 * fVar95 + fVar206 * fStack_a58) + fVar95 * fVar235;
                auVar239._12_4_ =
                     fVar226 * (fStack_a74 * fVar179 + fVar226 * fStack_a54) + fVar179 * fVar250;
                auVar184._0_4_ =
                     fVar202 * fVar228 + fVar259 * (fVar259 * local_a90 + local_a70 * fVar202);
                auVar184._4_4_ =
                     fVar203 * fVar230 + fVar94 * (fVar94 * fStack_a8c + fStack_a6c * fVar203);
                auVar184._8_4_ =
                     fVar206 * fVar235 + fVar95 * (fVar95 * fStack_a88 + fStack_a68 * fVar206);
                auVar184._12_4_ =
                     fVar226 * fVar250 + fVar179 * (fVar179 * fStack_a84 + fStack_a64 * fVar226);
                auVar138 = vshufps_avx(auVar238,auVar238,0);
                auVar139._0_4_ = auVar138._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar139._4_4_ = auVar138._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar139._8_4_ = auVar138._8_4_ * fStack_8e8 + 0.0;
                auVar139._12_4_ = auVar138._12_4_ * fStack_8e4 + 0.0;
                auVar102._0_4_ = fVar202 * auVar239._0_4_ + fVar259 * auVar184._0_4_;
                auVar102._4_4_ = fVar203 * auVar239._4_4_ + fVar94 * auVar184._4_4_;
                auVar102._8_4_ = fVar206 * auVar239._8_4_ + fVar95 * auVar184._8_4_;
                auVar102._12_4_ = fVar226 * auVar239._12_4_ + fVar179 * auVar184._12_4_;
                local_860._0_16_ = auVar102;
                auVar138 = vsubps_avx(auVar139,auVar102);
                _local_a00 = auVar138;
                auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
                fVar259 = auVar138._0_4_;
                if (fVar259 < 0.0) {
                  fVar94 = sqrtf(fVar259);
                }
                else {
                  auVar189 = vsqrtss_avx(auVar138,auVar138);
                  fVar94 = auVar189._0_4_;
                }
                auVar189 = vsubps_avx(auVar184,auVar239);
                auVar266._0_4_ = auVar189._0_4_ * 3.0;
                auVar266._4_4_ = auVar189._4_4_ * 3.0;
                auVar266._8_4_ = auVar189._8_4_ * 3.0;
                auVar266._12_4_ = auVar189._12_4_ * 3.0;
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar252 * 6.0)),ZEXT416((uint)(fVar252 * 6.0))
                                       ,0);
                auVar106 = ZEXT416((uint)((fVar201 - (fVar252 + fVar252)) * 6.0));
                auVar96 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar252 - (fVar201 + fVar201)) * 6.0));
                auVar97 = vshufps_avx(auVar106,auVar106,0);
                auVar98 = vshufps_avx(ZEXT416((uint)(fVar201 * 6.0)),ZEXT416((uint)(fVar201 * 6.0)),
                                      0);
                auVar106 = vdpps_avx(auVar266,auVar266,0x7f);
                auVar140._0_4_ =
                     auVar98._0_4_ * local_a60 +
                     auVar97._0_4_ * local_a80 +
                     auVar189._0_4_ * local_a90 + auVar96._0_4_ * local_a70;
                auVar140._4_4_ =
                     auVar98._4_4_ * fStack_a5c +
                     auVar97._4_4_ * fStack_a7c +
                     auVar189._4_4_ * fStack_a8c + auVar96._4_4_ * fStack_a6c;
                auVar140._8_4_ =
                     auVar98._8_4_ * fStack_a58 +
                     auVar97._8_4_ * fStack_a78 +
                     auVar189._8_4_ * fStack_a88 + auVar96._8_4_ * fStack_a68;
                auVar140._12_4_ =
                     auVar98._12_4_ * fStack_a54 +
                     auVar97._12_4_ * fStack_a74 +
                     auVar189._12_4_ * fStack_a84 + auVar96._12_4_ * fStack_a64;
                auVar189 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar96 = vrsqrtss_avx(auVar189,auVar189);
                fVar179 = auVar96._0_4_;
                fVar95 = auVar106._0_4_;
                auVar96 = vdpps_avx(auVar266,auVar140,0x7f);
                auVar97 = vshufps_avx(auVar106,auVar106,0);
                auVar141._0_4_ = auVar140._0_4_ * auVar97._0_4_;
                auVar141._4_4_ = auVar140._4_4_ * auVar97._4_4_;
                auVar141._8_4_ = auVar140._8_4_ * auVar97._8_4_;
                auVar141._12_4_ = auVar140._12_4_ * auVar97._12_4_;
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar211._0_4_ = auVar266._0_4_ * auVar96._0_4_;
                auVar211._4_4_ = auVar266._4_4_ * auVar96._4_4_;
                auVar211._8_4_ = auVar266._8_4_ * auVar96._8_4_;
                auVar211._12_4_ = auVar266._12_4_ * auVar96._12_4_;
                auVar98 = vsubps_avx(auVar141,auVar211);
                auVar96 = vrcpss_avx(auVar189,auVar189);
                auVar189 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(auVar238._0_4_ * (float)local_6a0._0_4_)));
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar95 * auVar96._0_4_)));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                uVar85 = CONCAT44(auVar266._4_4_,auVar266._0_4_);
                auVar326._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar326._8_4_ = -auVar266._8_4_;
                auVar326._12_4_ = -auVar266._12_4_;
                auVar97 = ZEXT416((uint)(fVar179 * 1.5 + fVar95 * -0.5 * fVar179 * fVar179 * fVar179
                                        ));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar185._0_4_ = auVar97._0_4_ * auVar98._0_4_ * auVar96._0_4_;
                auVar185._4_4_ = auVar97._4_4_ * auVar98._4_4_ * auVar96._4_4_;
                auVar185._8_4_ = auVar97._8_4_ * auVar98._8_4_ * auVar96._8_4_;
                auVar185._12_4_ = auVar97._12_4_ * auVar98._12_4_ * auVar96._12_4_;
                local_920._0_4_ = auVar266._0_4_ * auVar97._0_4_;
                local_920._4_4_ = auVar266._4_4_ * auVar97._4_4_;
                local_920._8_4_ = auVar266._8_4_ * auVar97._8_4_;
                local_920._12_4_ = auVar266._12_4_ * auVar97._12_4_;
                if (fVar95 < 0.0) {
                  fVar95 = sqrtf(fVar95);
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar95 = auVar106._0_4_;
                }
                auVar106 = vdpps_avx(_local_a00,local_920._0_16_,0x7f);
                fVar94 = ((float)local_9e0._0_4_ / fVar95) * (fVar94 + 1.0) +
                         fVar94 * (float)local_9e0._0_4_ + auVar189._0_4_;
                auVar96 = vdpps_avx(auVar326,local_920._0_16_,0x7f);
                auVar97 = vdpps_avx(_local_a00,auVar185,0x7f);
                auVar98 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar134 = vdpps_avx(_local_a00,auVar326,0x7f);
                fVar95 = auVar96._0_4_ + auVar97._0_4_;
                fVar179 = auVar106._0_4_;
                auVar103._0_4_ = fVar179 * fVar179;
                auVar103._4_4_ = auVar106._4_4_ * auVar106._4_4_;
                auVar103._8_4_ = auVar106._8_4_ * auVar106._8_4_;
                auVar103._12_4_ = auVar106._12_4_ * auVar106._12_4_;
                auVar97 = vsubps_avx(auVar138,auVar103);
                local_920._0_16_ = ZEXT416((uint)fVar95);
                auVar96 = vdpps_avx(_local_a00,_local_8f0,0x7f);
                fVar201 = auVar134._0_4_ - fVar179 * fVar95;
                fVar179 = auVar96._0_4_ - fVar179 * auVar98._0_4_;
                auVar96 = vrsqrtss_avx(auVar97,auVar97);
                fVar202 = auVar97._0_4_;
                fVar95 = auVar96._0_4_;
                fVar95 = fVar95 * 1.5 + fVar202 * -0.5 * fVar95 * fVar95 * fVar95;
                if (fVar202 < 0.0) {
                  local_8c0._0_4_ = fVar201;
                  local_6c0._0_4_ = fVar179;
                  local_6e0._0_4_ = fVar95;
                  fVar202 = sqrtf(fVar202);
                  fVar95 = (float)local_6e0._0_4_;
                  fVar201 = (float)local_8c0._0_4_;
                  fVar179 = (float)local_6c0._0_4_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar97,auVar97);
                  fVar202 = auVar96._0_4_;
                }
                auVar329 = ZEXT3264(local_9c0);
                auVar388 = ZEXT3264(local_940);
                auVar134 = vpermilps_avx(local_860._0_16_,0xff);
                auVar135 = vshufps_avx(auVar266,auVar266,0xff);
                fVar201 = fVar201 * fVar95 - auVar135._0_4_;
                auVar212._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar212._8_4_ = auVar98._8_4_ ^ 0x80000000;
                auVar212._12_4_ = auVar98._12_4_ ^ 0x80000000;
                auVar240._0_4_ = -fVar201;
                auVar240._4_4_ = 0x80000000;
                auVar240._8_4_ = 0x80000000;
                auVar240._12_4_ = 0x80000000;
                auVar96 = vinsertps_avx(auVar240,ZEXT416((uint)(fVar179 * fVar95)),0x1c);
                auVar98 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar179 * fVar95 -
                                                      auVar98._0_4_ * fVar201)));
                auVar96 = vdivps_avx(auVar96,auVar98);
                auVar97 = vinsertps_avx(local_920._0_16_,auVar212,0x10);
                auVar97 = vdivps_avx(auVar97,auVar98);
                auVar98 = vmovsldup_avx(auVar106);
                auVar108 = ZEXT416((uint)(fVar202 - auVar134._0_4_));
                auVar134 = vmovsldup_avx(auVar108);
                auVar166._0_4_ = auVar98._0_4_ * auVar96._0_4_ + auVar134._0_4_ * auVar97._0_4_;
                auVar166._4_4_ = auVar98._4_4_ * auVar96._4_4_ + auVar134._4_4_ * auVar97._4_4_;
                auVar166._8_4_ = auVar98._8_4_ * auVar96._8_4_ + auVar134._8_4_ * auVar97._8_4_;
                auVar166._12_4_ = auVar98._12_4_ * auVar96._12_4_ + auVar134._12_4_ * auVar97._12_4_
                ;
                auVar238 = vsubps_avx(auVar238,auVar166);
                auVar167._8_4_ = 0x7fffffff;
                auVar167._0_8_ = 0x7fffffff7fffffff;
                auVar167._12_4_ = 0x7fffffff;
                auVar106 = vandps_avx(auVar106,auVar167);
                if (auVar106._0_4_ < fVar94) {
                  auVar186._8_4_ = 0x7fffffff;
                  auVar186._0_8_ = 0x7fffffff7fffffff;
                  auVar186._12_4_ = 0x7fffffff;
                  auVar106 = vandps_avx(auVar108,auVar186);
                  if (auVar106._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar94 + auVar189._0_4_) {
                    fVar94 = auVar238._0_4_ + (float)local_810._0_4_;
                    auVar276 = ZEXT3264(local_9a0);
                    if ((fVar132 <= fVar94) &&
                       (fVar95 = *(float *)(ray + k * 4 + 0x80), fVar94 <= fVar95)) {
                      auVar189 = vmovshdup_avx(auVar238);
                      fVar179 = auVar189._0_4_;
                      if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                        auVar138 = vrsqrtss_avx(auVar138,auVar138);
                        fVar201 = auVar138._0_4_;
                        pGVar12 = (context->scene->geometries).items[uVar88].ptr;
                        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar138 = ZEXT416((uint)(fVar201 * 1.5 +
                                                   fVar259 * -0.5 * fVar201 * fVar201 * fVar201));
                          auVar138 = vshufps_avx(auVar138,auVar138,0);
                          auVar187._0_4_ = auVar138._0_4_ * (float)local_a00._0_4_;
                          auVar187._4_4_ = auVar138._4_4_ * (float)local_a00._4_4_;
                          auVar187._8_4_ = auVar138._8_4_ * fStack_9f8;
                          auVar187._12_4_ = auVar138._12_4_ * fStack_9f4;
                          auVar142._0_4_ = auVar266._0_4_ + auVar135._0_4_ * auVar187._0_4_;
                          auVar142._4_4_ = auVar266._4_4_ + auVar135._4_4_ * auVar187._4_4_;
                          auVar142._8_4_ = auVar266._8_4_ + auVar135._8_4_ * auVar187._8_4_;
                          auVar142._12_4_ = auVar266._12_4_ + auVar135._12_4_ * auVar187._12_4_;
                          auVar138 = vshufps_avx(auVar187,auVar187,0xc9);
                          auVar189 = vshufps_avx(auVar266,auVar266,0xc9);
                          auVar188._0_4_ = auVar189._0_4_ * auVar187._0_4_;
                          auVar188._4_4_ = auVar189._4_4_ * auVar187._4_4_;
                          auVar188._8_4_ = auVar189._8_4_ * auVar187._8_4_;
                          auVar188._12_4_ = auVar189._12_4_ * auVar187._12_4_;
                          auVar213._0_4_ = auVar266._0_4_ * auVar138._0_4_;
                          auVar213._4_4_ = auVar266._4_4_ * auVar138._4_4_;
                          auVar213._8_4_ = auVar266._8_4_ * auVar138._8_4_;
                          auVar213._12_4_ = auVar266._12_4_ * auVar138._12_4_;
                          auVar106 = vsubps_avx(auVar213,auVar188);
                          auVar138 = vshufps_avx(auVar106,auVar106,0xc9);
                          auVar189 = vshufps_avx(auVar142,auVar142,0xc9);
                          auVar214._0_4_ = auVar189._0_4_ * auVar138._0_4_;
                          auVar214._4_4_ = auVar189._4_4_ * auVar138._4_4_;
                          auVar214._8_4_ = auVar189._8_4_ * auVar138._8_4_;
                          auVar214._12_4_ = auVar189._12_4_ * auVar138._12_4_;
                          auVar138 = vshufps_avx(auVar106,auVar106,0xd2);
                          auVar143._0_4_ = auVar142._0_4_ * auVar138._0_4_;
                          auVar143._4_4_ = auVar142._4_4_ * auVar138._4_4_;
                          auVar143._8_4_ = auVar142._8_4_ * auVar138._8_4_;
                          auVar143._12_4_ = auVar142._12_4_ * auVar138._12_4_;
                          auVar138 = vsubps_avx(auVar214,auVar143);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar94;
                            uVar9 = vextractps_avx(auVar138,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                            uVar9 = vextractps_avx(auVar138,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                            *(int *)(ray + k * 4 + 0xe0) = auVar138._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar179;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar88;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar238,auVar238,0x55);
                            auVar238 = vshufps_avx(auVar138,auVar138,0x55);
                            auStack_650 = vshufps_avx(auVar138,auVar138,0xaa);
                            local_640 = vshufps_avx(auVar138,auVar138,0);
                            local_660 = (RTCHitN  [16])auVar238;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar86 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar86,uVar86);
                            _uStack_5e8 = CONCAT44(uVar86,uVar86);
                            uVar86 = context->user->instPrimID[0];
                            auVar144._4_4_ = uVar86;
                            auVar144._0_4_ = uVar86;
                            auVar144._8_4_ = uVar86;
                            auVar144._12_4_ = uVar86;
                            auStack_5e0 = auVar144;
                            *(float *)(ray + k * 4 + 0x80) = fVar94;
                            local_840._0_16_ = *local_948;
                            local_a50.valid = (int *)local_840;
                            local_a50.geometryUserPtr = pGVar12->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            auVar138 = *local_948;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar12->intersectionFilterN)(&local_a50);
                              auVar276._8_56_ = extraout_var;
                              auVar276._0_8_ = extraout_XMM1_Qa;
                              auVar144 = auVar276._0_16_;
                              auVar276 = ZEXT3264(local_9a0);
                              auVar388 = ZEXT3264(local_940);
                              auVar329 = ZEXT3264(local_9c0);
                              auVar138 = local_840._0_16_;
                            }
                            if (auVar138 == (undefined1  [16])0x0) {
                              auVar238 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar138 = vpcmpeqd_avx(auVar144,auVar144);
                              auVar238 = auVar238 ^ auVar138;
                            }
                            else {
                              p_Var17 = context->args->filter;
                              auVar189 = vpcmpeqd_avx(auVar238,auVar238);
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var17)(&local_a50);
                                auVar276 = ZEXT3264(local_9a0);
                                auVar388 = ZEXT3264(local_940);
                                auVar329 = ZEXT3264(local_9c0);
                                auVar189 = vpcmpeqd_avx(auVar189,auVar189);
                                auVar138 = local_840._0_16_;
                              }
                              auVar106 = vpcmpeqd_avx(auVar138,_DAT_01f7aa10);
                              auVar238 = auVar106 ^ auVar189;
                              if (auVar138 != (undefined1  [16])0x0) {
                                auVar106 = auVar106 ^ auVar189;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    local_a50.hit);
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar138;
                              }
                            }
                            auVar104._8_8_ = 0x100000001;
                            auVar104._0_8_ = 0x100000001;
                            if ((auVar104 & auVar238) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar95;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar92 = lVar92 + -1;
                auVar276 = ZEXT3264(local_9a0);
              } while (lVar92 != 0);
              auVar268 = local_4a0;
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar9;
              auVar118._0_4_ = uVar9;
              auVar118._8_4_ = uVar9;
              auVar118._12_4_ = uVar9;
              auVar118._16_4_ = uVar9;
              auVar118._20_4_ = uVar9;
              auVar118._24_4_ = uVar9;
              auVar118._28_4_ = uVar9;
              auVar111 = vcmpps_avx(_local_8e0,auVar118,2);
              local_4a0 = vandps_avx(auVar111,local_4a0);
              auVar348 = ZEXT3264(local_4a0);
              auVar268 = auVar268 & auVar111;
              auVar219 = local_740._0_28_;
            } while ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar268 >> 0x7f,0) != '\0') ||
                       (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar268 >> 0xbf,0) != '\0') ||
                     (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar268[0x1f] < '\0');
            auVar348 = ZEXT3264(local_380);
            fVar259 = (float)local_5a0._0_4_;
            fVar94 = (float)local_5a0._4_4_;
            fVar95 = fStack_598;
            fVar179 = fStack_594;
            fVar201 = fStack_590;
            fVar202 = fStack_58c;
            fVar203 = fStack_588;
            fVar206 = fStack_584;
          }
          auVar158._0_4_ =
               auVar219._0_4_ * (float)local_780._0_4_ +
               (float)local_760._0_4_ * (float)local_7a0._0_4_ +
               (float)local_720._0_4_ * (float)local_7c0._0_4_;
          auVar158._4_4_ =
               auVar219._4_4_ * (float)local_780._4_4_ +
               (float)local_760._4_4_ * (float)local_7a0._4_4_ +
               (float)local_720._4_4_ * (float)local_7c0._4_4_;
          auVar158._8_4_ =
               auVar219._8_4_ * fStack_778 + fStack_758 * fStack_798 + fStack_718 * fStack_7b8;
          auVar158._12_4_ =
               auVar219._12_4_ * fStack_774 + fStack_754 * fStack_794 + fStack_714 * fStack_7b4;
          auVar158._16_4_ =
               auVar219._16_4_ * fStack_770 + fStack_750 * fStack_790 + fStack_710 * fStack_7b0;
          auVar158._20_4_ =
               auVar219._20_4_ * fStack_76c + fStack_74c * fStack_78c + fStack_70c * fStack_7ac;
          auVar158._24_4_ =
               auVar219._24_4_ * fStack_768 + fStack_748 * fStack_788 + fStack_708 * fStack_7a8;
          auVar158._28_4_ = fStack_744 + fStack_744 + auVar348._28_4_;
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar174._16_4_ = 0x7fffffff;
          auVar174._20_4_ = 0x7fffffff;
          auVar174._24_4_ = 0x7fffffff;
          auVar174._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar158,auVar174);
          auVar175._8_4_ = 0x3e99999a;
          auVar175._0_8_ = 0x3e99999a3e99999a;
          auVar175._12_4_ = 0x3e99999a;
          auVar175._16_4_ = 0x3e99999a;
          auVar175._20_4_ = 0x3e99999a;
          auVar175._24_4_ = 0x3e99999a;
          auVar175._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar175,1);
          auVar268 = vorps_avx(auVar111,local_520);
          auVar176._0_4_ = fVar259 + (float)local_880;
          auVar176._4_4_ = fVar94 + local_880._4_4_;
          auVar176._8_4_ = fVar95 + (float)uStack_878;
          auVar176._12_4_ = fVar179 + uStack_878._4_4_;
          auVar176._16_4_ = fVar201 + (float)uStack_870;
          auVar176._20_4_ = fVar202 + uStack_870._4_4_;
          auVar176._24_4_ = fVar203 + (float)uStack_868;
          auVar176._28_4_ = fVar206 + uStack_868._4_4_;
          auVar111 = vcmpps_avx(auVar176,auVar118,2);
          _local_7c0 = vandps_avx(auVar111,local_500);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar200._8_4_ = 2;
          auVar200._0_8_ = 0x200000002;
          auVar200._12_4_ = 2;
          auVar200._16_4_ = 2;
          auVar200._20_4_ = 2;
          auVar200._24_4_ = 2;
          auVar200._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar200,auVar177,auVar268);
          auVar80._4_4_ = fStack_57c;
          auVar80._0_4_ = local_580;
          auVar80._8_4_ = fStack_578;
          auVar80._12_4_ = fStack_574;
          auVar238 = vpcmpgtd_avx(auVar111._16_16_,auVar80);
          auVar138 = vpshufd_avx(local_540._0_16_,0);
          auVar138 = vpcmpgtd_avx(auVar111._0_16_,auVar138);
          auVar178._16_16_ = auVar238;
          auVar178._0_16_ = auVar118._0_16_;
          _local_7a0 = vblendps_avx(ZEXT1632(auVar138),auVar178,0xf0);
          auVar111 = vandnps_avx(_local_7a0,_local_7c0);
          auVar268 = _local_7c0 & ~_local_7a0;
          local_840 = auVar111;
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar268 >> 0xbf,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar268[0x1f] < '\0') {
            local_780._4_4_ = local_880._4_4_ + local_380._4_4_;
            local_780._0_4_ = (float)local_880 + local_380._0_4_;
            fStack_778 = (float)uStack_878 + local_380._8_4_;
            fStack_774 = uStack_878._4_4_ + local_380._12_4_;
            fStack_770 = (float)uStack_870 + local_380._16_4_;
            fStack_76c = uStack_870._4_4_ + local_380._20_4_;
            fStack_768 = (float)uStack_868 + local_380._24_4_;
            fStack_764 = uStack_868._4_4_ + local_380._28_4_;
            _local_8e0 = local_380;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar268 = vblendvps_avx(auVar120,_local_8e0,auVar111);
              auVar112 = vshufps_avx(auVar268,auVar268,0xb1);
              auVar112 = vminps_avx(auVar268,auVar112);
              auVar151 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar151);
              auVar151 = vperm2f128_avx(auVar112,auVar112,1);
              auVar112 = vminps_avx(auVar112,auVar151);
              auVar112 = vcmpps_avx(auVar268,auVar112,0);
              auVar151 = auVar111 & auVar112;
              auVar268 = auVar111;
              if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar151 >> 0x7f,0) != '\0') ||
                    (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar151 >> 0xbf,0) != '\0') ||
                  (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar151[0x1f] < '\0') {
                auVar268 = vandps_avx(auVar112,auVar111);
              }
              uVar83 = vmovmskps_avx(auVar268);
              uVar86 = 0;
              if (uVar83 != 0) {
                for (; (uVar83 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
                }
              }
              uVar85 = (ulong)uVar86;
              local_840 = auVar111;
              *(undefined4 *)(local_840 + uVar85 * 4) = 0;
              fVar259 = local_1c0[uVar85];
              uVar86 = *(uint *)(local_360 + uVar85 * 4);
              fVar94 = auVar137._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar94 = sqrtf((float)local_900._0_4_);
              }
              auVar138 = vminps_avx(auVar31,auVar33);
              auVar238 = vmaxps_avx(auVar31,auVar33);
              auVar189 = vminps_avx(auVar32,auVar34);
              auVar106 = vminps_avx(auVar138,auVar189);
              auVar138 = vmaxps_avx(auVar32,auVar34);
              auVar189 = vmaxps_avx(auVar238,auVar138);
              auVar190._8_4_ = 0x7fffffff;
              auVar190._0_8_ = 0x7fffffff7fffffff;
              auVar190._12_4_ = 0x7fffffff;
              auVar238 = vandps_avx(auVar106,auVar190);
              auVar138 = vandps_avx(auVar189,auVar190);
              auVar238 = vmaxps_avx(auVar238,auVar138);
              auVar138 = vmovshdup_avx(auVar238);
              auVar138 = vmaxss_avx(auVar138,auVar238);
              auVar238 = vshufpd_avx(auVar238,auVar238,1);
              auVar238 = vmaxss_avx(auVar238,auVar138);
              local_9e0._0_4_ = auVar238._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar94 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
              auVar238 = vinsertps_avx(ZEXT416(uVar86),ZEXT416((uint)fVar259),0x10);
              lVar92 = 5;
              do {
                auVar138 = vmovshdup_avx(auVar238);
                fVar252 = auVar138._0_4_;
                fVar201 = 1.0 - fVar252;
                auVar138 = vshufps_avx(auVar238,auVar238,0x55);
                fVar259 = auVar138._0_4_;
                fVar94 = auVar138._4_4_;
                fVar95 = auVar138._8_4_;
                fVar179 = auVar138._12_4_;
                auVar138 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                fVar202 = auVar138._0_4_;
                fVar203 = auVar138._4_4_;
                fVar206 = auVar138._8_4_;
                fVar226 = auVar138._12_4_;
                fVar228 = local_a70 * fVar259 + local_a80 * fVar202;
                fVar230 = fStack_a6c * fVar94 + fStack_a7c * fVar203;
                fVar235 = fStack_a68 * fVar95 + fStack_a78 * fVar206;
                fVar250 = fStack_a64 * fVar179 + fStack_a74 * fVar226;
                auVar241._0_4_ =
                     fVar202 * (local_a80 * fVar259 + fVar202 * local_a60) + fVar259 * fVar228;
                auVar241._4_4_ =
                     fVar203 * (fStack_a7c * fVar94 + fVar203 * fStack_a5c) + fVar94 * fVar230;
                auVar241._8_4_ =
                     fVar206 * (fStack_a78 * fVar95 + fVar206 * fStack_a58) + fVar95 * fVar235;
                auVar241._12_4_ =
                     fVar226 * (fStack_a74 * fVar179 + fVar226 * fStack_a54) + fVar179 * fVar250;
                auVar191._0_4_ =
                     fVar202 * fVar228 + fVar259 * (fVar259 * local_a90 + local_a70 * fVar202);
                auVar191._4_4_ =
                     fVar203 * fVar230 + fVar94 * (fVar94 * fStack_a8c + fStack_a6c * fVar203);
                auVar191._8_4_ =
                     fVar206 * fVar235 + fVar95 * (fVar95 * fStack_a88 + fStack_a68 * fVar206);
                auVar191._12_4_ =
                     fVar226 * fVar250 + fVar179 * (fVar179 * fStack_a84 + fStack_a64 * fVar226);
                auVar138 = vshufps_avx(auVar238,auVar238,0);
                auVar145._0_4_ = auVar138._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar145._4_4_ = auVar138._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar145._8_4_ = auVar138._8_4_ * fStack_8e8 + 0.0;
                auVar145._12_4_ = auVar138._12_4_ * fStack_8e4 + 0.0;
                auVar105._0_4_ = fVar202 * auVar241._0_4_ + fVar259 * auVar191._0_4_;
                auVar105._4_4_ = fVar203 * auVar241._4_4_ + fVar94 * auVar191._4_4_;
                auVar105._8_4_ = fVar206 * auVar241._8_4_ + fVar95 * auVar191._8_4_;
                auVar105._12_4_ = fVar226 * auVar241._12_4_ + fVar179 * auVar191._12_4_;
                local_860._0_16_ = auVar105;
                auVar138 = vsubps_avx(auVar145,auVar105);
                _local_a00 = auVar138;
                auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
                fVar259 = auVar138._0_4_;
                if (fVar259 < 0.0) {
                  fVar94 = sqrtf(fVar259);
                }
                else {
                  auVar189 = vsqrtss_avx(auVar138,auVar138);
                  fVar94 = auVar189._0_4_;
                }
                auVar189 = vsubps_avx(auVar191,auVar241);
                auVar267._0_4_ = auVar189._0_4_ * 3.0;
                auVar267._4_4_ = auVar189._4_4_ * 3.0;
                auVar267._8_4_ = auVar189._8_4_ * 3.0;
                auVar267._12_4_ = auVar189._12_4_ * 3.0;
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar252 * 6.0)),ZEXT416((uint)(fVar252 * 6.0))
                                       ,0);
                auVar106 = ZEXT416((uint)((fVar201 - (fVar252 + fVar252)) * 6.0));
                auVar96 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar252 - (fVar201 + fVar201)) * 6.0));
                auVar97 = vshufps_avx(auVar106,auVar106,0);
                auVar98 = vshufps_avx(ZEXT416((uint)(fVar201 * 6.0)),ZEXT416((uint)(fVar201 * 6.0)),
                                      0);
                auVar106 = vdpps_avx(auVar267,auVar267,0x7f);
                auVar146._0_4_ =
                     auVar98._0_4_ * local_a60 +
                     auVar97._0_4_ * local_a80 +
                     auVar189._0_4_ * local_a90 + auVar96._0_4_ * local_a70;
                auVar146._4_4_ =
                     auVar98._4_4_ * fStack_a5c +
                     auVar97._4_4_ * fStack_a7c +
                     auVar189._4_4_ * fStack_a8c + auVar96._4_4_ * fStack_a6c;
                auVar146._8_4_ =
                     auVar98._8_4_ * fStack_a58 +
                     auVar97._8_4_ * fStack_a78 +
                     auVar189._8_4_ * fStack_a88 + auVar96._8_4_ * fStack_a68;
                auVar146._12_4_ =
                     auVar98._12_4_ * fStack_a54 +
                     auVar97._12_4_ * fStack_a74 +
                     auVar189._12_4_ * fStack_a84 + auVar96._12_4_ * fStack_a64;
                auVar189 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar96 = vrsqrtss_avx(auVar189,auVar189);
                fVar179 = auVar96._0_4_;
                fVar95 = auVar106._0_4_;
                auVar96 = vdpps_avx(auVar267,auVar146,0x7f);
                auVar97 = vshufps_avx(auVar106,auVar106,0);
                auVar147._0_4_ = auVar146._0_4_ * auVar97._0_4_;
                auVar147._4_4_ = auVar146._4_4_ * auVar97._4_4_;
                auVar147._8_4_ = auVar146._8_4_ * auVar97._8_4_;
                auVar147._12_4_ = auVar146._12_4_ * auVar97._12_4_;
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar215._0_4_ = auVar267._0_4_ * auVar96._0_4_;
                auVar215._4_4_ = auVar267._4_4_ * auVar96._4_4_;
                auVar215._8_4_ = auVar267._8_4_ * auVar96._8_4_;
                auVar215._12_4_ = auVar267._12_4_ * auVar96._12_4_;
                auVar98 = vsubps_avx(auVar147,auVar215);
                auVar96 = vrcpss_avx(auVar189,auVar189);
                auVar189 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(auVar238._0_4_ * (float)local_6a0._0_4_)));
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar95 * auVar96._0_4_)));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                uVar85 = CONCAT44(auVar267._4_4_,auVar267._0_4_);
                auVar327._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar327._8_4_ = -auVar267._8_4_;
                auVar327._12_4_ = -auVar267._12_4_;
                auVar97 = ZEXT416((uint)(fVar179 * 1.5 + fVar95 * -0.5 * fVar179 * fVar179 * fVar179
                                        ));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar192._0_4_ = auVar97._0_4_ * auVar98._0_4_ * auVar96._0_4_;
                auVar192._4_4_ = auVar97._4_4_ * auVar98._4_4_ * auVar96._4_4_;
                auVar192._8_4_ = auVar97._8_4_ * auVar98._8_4_ * auVar96._8_4_;
                auVar192._12_4_ = auVar97._12_4_ * auVar98._12_4_ * auVar96._12_4_;
                local_920._0_4_ = auVar267._0_4_ * auVar97._0_4_;
                local_920._4_4_ = auVar267._4_4_ * auVar97._4_4_;
                local_920._8_4_ = auVar267._8_4_ * auVar97._8_4_;
                local_920._12_4_ = auVar267._12_4_ * auVar97._12_4_;
                if (fVar95 < 0.0) {
                  fVar95 = sqrtf(fVar95);
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar95 = auVar106._0_4_;
                }
                auVar106 = vdpps_avx(_local_a00,local_920._0_16_,0x7f);
                fVar94 = ((float)local_9e0._0_4_ / fVar95) * (fVar94 + 1.0) +
                         fVar94 * (float)local_9e0._0_4_ + auVar189._0_4_;
                auVar96 = vdpps_avx(auVar327,local_920._0_16_,0x7f);
                auVar97 = vdpps_avx(_local_a00,auVar192,0x7f);
                auVar98 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar134 = vdpps_avx(_local_a00,auVar327,0x7f);
                fVar95 = auVar96._0_4_ + auVar97._0_4_;
                fVar179 = auVar106._0_4_;
                auVar107._0_4_ = fVar179 * fVar179;
                auVar107._4_4_ = auVar106._4_4_ * auVar106._4_4_;
                auVar107._8_4_ = auVar106._8_4_ * auVar106._8_4_;
                auVar107._12_4_ = auVar106._12_4_ * auVar106._12_4_;
                auVar97 = vsubps_avx(auVar138,auVar107);
                local_920._0_16_ = ZEXT416((uint)fVar95);
                auVar96 = vdpps_avx(_local_a00,_local_8f0,0x7f);
                fVar201 = auVar134._0_4_ - fVar179 * fVar95;
                fVar179 = auVar96._0_4_ - fVar179 * auVar98._0_4_;
                auVar96 = vrsqrtss_avx(auVar97,auVar97);
                fVar202 = auVar97._0_4_;
                fVar95 = auVar96._0_4_;
                fVar95 = fVar95 * 1.5 + fVar202 * -0.5 * fVar95 * fVar95 * fVar95;
                if (fVar202 < 0.0) {
                  local_8c0._0_4_ = fVar201;
                  local_6c0._0_4_ = fVar179;
                  local_6e0._0_4_ = fVar95;
                  fVar202 = sqrtf(fVar202);
                  fVar95 = (float)local_6e0._0_4_;
                  fVar201 = (float)local_8c0._0_4_;
                  fVar179 = (float)local_6c0._0_4_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar97,auVar97);
                  fVar202 = auVar96._0_4_;
                }
                auVar329 = ZEXT3264(local_9c0);
                auVar134 = vpermilps_avx(local_860._0_16_,0xff);
                auVar135 = vshufps_avx(auVar267,auVar267,0xff);
                fVar201 = fVar201 * fVar95 - auVar135._0_4_;
                auVar216._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar216._8_4_ = auVar98._8_4_ ^ 0x80000000;
                auVar216._12_4_ = auVar98._12_4_ ^ 0x80000000;
                auVar242._0_4_ = -fVar201;
                auVar242._4_4_ = 0x80000000;
                auVar242._8_4_ = 0x80000000;
                auVar242._12_4_ = 0x80000000;
                auVar96 = vinsertps_avx(auVar242,ZEXT416((uint)(fVar179 * fVar95)),0x1c);
                auVar98 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar179 * fVar95 -
                                                      auVar98._0_4_ * fVar201)));
                auVar96 = vdivps_avx(auVar96,auVar98);
                auVar97 = vinsertps_avx(local_920._0_16_,auVar216,0x10);
                auVar97 = vdivps_avx(auVar97,auVar98);
                auVar98 = vmovsldup_avx(auVar106);
                auVar108 = ZEXT416((uint)(fVar202 - auVar134._0_4_));
                auVar134 = vmovsldup_avx(auVar108);
                auVar168._0_4_ = auVar98._0_4_ * auVar96._0_4_ + auVar134._0_4_ * auVar97._0_4_;
                auVar168._4_4_ = auVar98._4_4_ * auVar96._4_4_ + auVar134._4_4_ * auVar97._4_4_;
                auVar168._8_4_ = auVar98._8_4_ * auVar96._8_4_ + auVar134._8_4_ * auVar97._8_4_;
                auVar168._12_4_ = auVar98._12_4_ * auVar96._12_4_ + auVar134._12_4_ * auVar97._12_4_
                ;
                auVar238 = vsubps_avx(auVar238,auVar168);
                auVar169._8_4_ = 0x7fffffff;
                auVar169._0_8_ = 0x7fffffff7fffffff;
                auVar169._12_4_ = 0x7fffffff;
                auVar106 = vandps_avx(auVar106,auVar169);
                if (auVar106._0_4_ < fVar94) {
                  auVar193._8_4_ = 0x7fffffff;
                  auVar193._0_8_ = 0x7fffffff7fffffff;
                  auVar193._12_4_ = 0x7fffffff;
                  auVar106 = vandps_avx(auVar108,auVar193);
                  if (auVar106._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar94 + auVar189._0_4_) {
                    fVar94 = auVar238._0_4_ + (float)local_810._0_4_;
                    auVar276 = ZEXT3264(local_9a0);
                    if ((fVar132 <= fVar94) &&
                       (fVar95 = *(float *)(ray + k * 4 + 0x80), fVar94 <= fVar95)) {
                      auVar189 = vmovshdup_avx(auVar238);
                      fVar179 = auVar189._0_4_;
                      if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                        auVar138 = vrsqrtss_avx(auVar138,auVar138);
                        fVar201 = auVar138._0_4_;
                        pGVar12 = (context->scene->geometries).items[uVar88].ptr;
                        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar138 = ZEXT416((uint)(fVar201 * 1.5 +
                                                   fVar259 * -0.5 * fVar201 * fVar201 * fVar201));
                          auVar138 = vshufps_avx(auVar138,auVar138,0);
                          auVar194._0_4_ = auVar138._0_4_ * (float)local_a00._0_4_;
                          auVar194._4_4_ = auVar138._4_4_ * (float)local_a00._4_4_;
                          auVar194._8_4_ = auVar138._8_4_ * fStack_9f8;
                          auVar194._12_4_ = auVar138._12_4_ * fStack_9f4;
                          auVar148._0_4_ = auVar267._0_4_ + auVar135._0_4_ * auVar194._0_4_;
                          auVar148._4_4_ = auVar267._4_4_ + auVar135._4_4_ * auVar194._4_4_;
                          auVar148._8_4_ = auVar267._8_4_ + auVar135._8_4_ * auVar194._8_4_;
                          auVar148._12_4_ = auVar267._12_4_ + auVar135._12_4_ * auVar194._12_4_;
                          auVar138 = vshufps_avx(auVar194,auVar194,0xc9);
                          auVar189 = vshufps_avx(auVar267,auVar267,0xc9);
                          auVar195._0_4_ = auVar189._0_4_ * auVar194._0_4_;
                          auVar195._4_4_ = auVar189._4_4_ * auVar194._4_4_;
                          auVar195._8_4_ = auVar189._8_4_ * auVar194._8_4_;
                          auVar195._12_4_ = auVar189._12_4_ * auVar194._12_4_;
                          auVar217._0_4_ = auVar267._0_4_ * auVar138._0_4_;
                          auVar217._4_4_ = auVar267._4_4_ * auVar138._4_4_;
                          auVar217._8_4_ = auVar267._8_4_ * auVar138._8_4_;
                          auVar217._12_4_ = auVar267._12_4_ * auVar138._12_4_;
                          auVar106 = vsubps_avx(auVar217,auVar195);
                          auVar138 = vshufps_avx(auVar106,auVar106,0xc9);
                          auVar189 = vshufps_avx(auVar148,auVar148,0xc9);
                          auVar218._0_4_ = auVar189._0_4_ * auVar138._0_4_;
                          auVar218._4_4_ = auVar189._4_4_ * auVar138._4_4_;
                          auVar218._8_4_ = auVar189._8_4_ * auVar138._8_4_;
                          auVar218._12_4_ = auVar189._12_4_ * auVar138._12_4_;
                          auVar138 = vshufps_avx(auVar106,auVar106,0xd2);
                          auVar149._0_4_ = auVar148._0_4_ * auVar138._0_4_;
                          auVar149._4_4_ = auVar148._4_4_ * auVar138._4_4_;
                          auVar149._8_4_ = auVar148._8_4_ * auVar138._8_4_;
                          auVar149._12_4_ = auVar148._12_4_ * auVar138._12_4_;
                          auVar138 = vsubps_avx(auVar218,auVar149);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar94;
                            uVar9 = vextractps_avx(auVar138,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                            uVar9 = vextractps_avx(auVar138,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                            *(int *)(ray + k * 4 + 0xe0) = auVar138._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar179;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar88;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar238,auVar238,0x55);
                            auVar238 = vshufps_avx(auVar138,auVar138,0x55);
                            auStack_650 = vshufps_avx(auVar138,auVar138,0xaa);
                            local_640 = vshufps_avx(auVar138,auVar138,0);
                            local_660 = (RTCHitN  [16])auVar238;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar86 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar86,uVar86);
                            _uStack_5e8 = CONCAT44(uVar86,uVar86);
                            uVar86 = context->user->instPrimID[0];
                            auVar150._4_4_ = uVar86;
                            auVar150._0_4_ = uVar86;
                            auVar150._8_4_ = uVar86;
                            auVar150._12_4_ = uVar86;
                            auStack_5e0 = auVar150;
                            *(float *)(ray + k * 4 + 0x80) = fVar94;
                            local_800 = *local_948;
                            local_a50.valid = (int *)local_800;
                            local_a50.geometryUserPtr = pGVar12->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar12->intersectionFilterN)(&local_a50);
                              auVar329._8_56_ = extraout_var_00;
                              auVar329._0_8_ = extraout_XMM1_Qa_00;
                              auVar150 = auVar329._0_16_;
                              auVar276 = ZEXT3264(local_9a0);
                              auVar329 = ZEXT3264(local_9c0);
                            }
                            if (local_800 == (undefined1  [16])0x0) {
                              auVar238 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar138 = vpcmpeqd_avx(auVar150,auVar150);
                              auVar238 = auVar238 ^ auVar138;
                            }
                            else {
                              p_Var17 = context->args->filter;
                              auVar138 = vpcmpeqd_avx(auVar238,auVar238);
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var17)(&local_a50);
                                auVar276 = ZEXT3264(local_9a0);
                                auVar329 = ZEXT3264(local_9c0);
                                auVar138 = vpcmpeqd_avx(auVar138,auVar138);
                              }
                              auVar189 = vpcmpeqd_avx(local_800,_DAT_01f7aa10);
                              auVar238 = auVar189 ^ auVar138;
                              if (local_800 != (undefined1  [16])0x0) {
                                auVar189 = auVar189 ^ auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    local_a50.hit);
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar138;
                                auVar138 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar138;
                              }
                            }
                            auVar109._8_8_ = 0x100000001;
                            auVar109._0_8_ = 0x100000001;
                            if ((auVar109 & auVar238) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar95;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar92 = lVar92 + -1;
                auVar276 = ZEXT3264(local_9a0);
              } while (lVar92 != 0);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar9;
              auVar118._0_4_ = uVar9;
              auVar118._8_4_ = uVar9;
              auVar118._12_4_ = uVar9;
              auVar118._16_4_ = uVar9;
              auVar118._20_4_ = uVar9;
              auVar118._24_4_ = uVar9;
              auVar118._28_4_ = uVar9;
              auVar268 = vcmpps_avx(_local_780,auVar118,2);
              auVar111 = vandps_avx(auVar268,local_840);
              auVar268 = local_840 & auVar268;
            } while ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar268 >> 0x7f,0) != '\0') ||
                       (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar268 >> 0xbf,0) != '\0') ||
                     (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar268[0x1f] < '\0');
            auVar388 = ZEXT3264(local_940);
            local_840 = auVar111;
          }
          auVar391 = ZEXT3264(local_a20);
          auVar348 = ZEXT3264(local_980);
          auVar111 = vandps_avx(local_4e0,_local_4c0);
          auVar268 = vandps_avx(_local_7c0,_local_7a0);
          auVar224._0_4_ = (float)local_880 + local_3c0._0_4_;
          auVar224._4_4_ = local_880._4_4_ + local_3c0._4_4_;
          auVar224._8_4_ = (float)uStack_878 + local_3c0._8_4_;
          auVar224._12_4_ = uStack_878._4_4_ + local_3c0._12_4_;
          auVar224._16_4_ = (float)uStack_870 + local_3c0._16_4_;
          auVar224._20_4_ = uStack_870._4_4_ + local_3c0._20_4_;
          auVar224._24_4_ = (float)uStack_868 + local_3c0._24_4_;
          auVar224._28_4_ = uStack_868._4_4_ + local_3c0._28_4_;
          auVar112 = vcmpps_avx(auVar224,auVar118,2);
          auVar111 = vandps_avx(auVar112,auVar111);
          auVar225._0_4_ = (float)local_880 + local_380._0_4_;
          auVar225._4_4_ = local_880._4_4_ + local_380._4_4_;
          auVar225._8_4_ = (float)uStack_878 + local_380._8_4_;
          auVar225._12_4_ = uStack_878._4_4_ + local_380._12_4_;
          auVar225._16_4_ = (float)uStack_870 + local_380._16_4_;
          auVar225._20_4_ = uStack_870._4_4_ + local_380._20_4_;
          auVar225._24_4_ = (float)uStack_868 + local_380._24_4_;
          auVar225._28_4_ = uStack_868._4_4_ + local_380._28_4_;
          auVar112 = vcmpps_avx(auVar225,auVar118,2);
          auVar268 = vandps_avx(auVar112,auVar268);
          auVar268 = vorps_avx(auVar111,auVar268);
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar268 >> 0xbf,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar268[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar268;
            auVar111 = vblendvps_avx(local_380,_local_3c0,auVar111);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar111;
            uVar10 = vmovlps_avx(local_470);
            (&uStack_140)[uVar91 * 0xc] = uVar10;
            aiStack_138[uVar91 * 0x18] = local_c08 + 1;
            iVar90 = iVar90 + 1;
          }
          goto LAB_00f66532;
        }
      }
      auVar391 = ZEXT3264(local_a20);
      auVar388 = ZEXT3264(local_940);
      auVar348 = ZEXT3264(local_980);
      auVar329 = ZEXT3264(local_9c0);
      auVar276 = ZEXT3264(local_9a0);
    }
LAB_00f66532:
    auVar268 = local_400;
    if (iVar90 == 0) break;
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar115._4_4_ = uVar9;
    auVar115._0_4_ = uVar9;
    auVar115._8_4_ = uVar9;
    auVar115._12_4_ = uVar9;
    auVar115._16_4_ = uVar9;
    auVar115._20_4_ = uVar9;
    auVar115._24_4_ = uVar9;
    auVar115._28_4_ = uVar9;
    uVar86 = -iVar90;
    pauVar84 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar90 - 1) * 0x60);
    while( true ) {
      auVar111 = pauVar84[1];
      auVar153._0_4_ = (float)local_880 + auVar111._0_4_;
      auVar153._4_4_ = local_880._4_4_ + auVar111._4_4_;
      auVar153._8_4_ = (float)uStack_878 + auVar111._8_4_;
      auVar153._12_4_ = uStack_878._4_4_ + auVar111._12_4_;
      auVar153._16_4_ = (float)uStack_870 + auVar111._16_4_;
      auVar153._20_4_ = uStack_870._4_4_ + auVar111._20_4_;
      auVar153._24_4_ = (float)uStack_868 + auVar111._24_4_;
      auVar153._28_4_ = uStack_868._4_4_ + auVar111._28_4_;
      auVar151 = vcmpps_avx(auVar153,auVar115,2);
      auVar112 = vandps_avx(auVar151,*pauVar84);
      _local_660 = auVar112;
      auVar151 = *pauVar84 & auVar151;
      if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar151 >> 0x7f,0) != '\0') ||
            (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar151 >> 0xbf,0) != '\0') ||
          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar151[0x1f] < '\0') break;
      pauVar84 = pauVar84 + -3;
      uVar86 = uVar86 + 1;
      if (uVar86 == 0) goto LAB_00f680f9;
    }
    auVar116._8_4_ = 0x7f800000;
    auVar116._0_8_ = 0x7f8000007f800000;
    auVar116._12_4_ = 0x7f800000;
    auVar116._16_4_ = 0x7f800000;
    auVar116._20_4_ = 0x7f800000;
    auVar116._24_4_ = 0x7f800000;
    auVar116._28_4_ = 0x7f800000;
    auVar111 = vblendvps_avx(auVar116,auVar111,auVar112);
    auVar151 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar151 = vminps_avx(auVar111,auVar151);
    auVar171 = vshufpd_avx(auVar151,auVar151,5);
    auVar151 = vminps_avx(auVar151,auVar171);
    auVar171 = vperm2f128_avx(auVar151,auVar151,1);
    auVar151 = vminps_avx(auVar151,auVar171);
    auVar111 = vcmpps_avx(auVar111,auVar151,0);
    auVar151 = auVar112 & auVar111;
    if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar151 >> 0x7f,0) != '\0') ||
          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar151 >> 0xbf,0) != '\0') ||
        (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar151[0x1f] < '\0') {
      auVar112 = vandps_avx(auVar111,auVar112);
    }
    auVar101._8_8_ = 0;
    auVar101._0_8_ = *(ulong *)pauVar84[2];
    local_c08 = *(uint *)(pauVar84[2] + 8);
    uVar87 = vmovmskps_avx(auVar112);
    uVar83 = 0;
    if (uVar87 != 0) {
      for (; (uVar87 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
      }
    }
    *(undefined4 *)(local_660 + (ulong)uVar83 * 4) = 0;
    *pauVar84 = _local_660;
    uVar87 = ~uVar86;
    if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_660 >> 0x7f,0) != '\0') ||
          (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_660 >> 0xbf,0) != '\0') ||
        (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      uVar87 = -uVar86;
    }
    uVar91 = (ulong)uVar87;
    auVar238 = vshufps_avx(auVar101,auVar101,0);
    auVar138 = vshufps_avx(auVar101,auVar101,0x55);
    auVar138 = vsubps_avx(auVar138,auVar238);
    local_3c0._4_4_ = auVar238._4_4_ + auVar138._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar238._0_4_ + auVar138._0_4_ * 0.0;
    fStack_3b8 = auVar238._8_4_ + auVar138._8_4_ * 0.2857143;
    fStack_3b4 = auVar238._12_4_ + auVar138._12_4_ * 0.42857146;
    fStack_3b0 = auVar238._0_4_ + auVar138._0_4_ * 0.5714286;
    fStack_3ac = auVar238._4_4_ + auVar138._4_4_ * 0.71428573;
    fStack_3a8 = auVar238._8_4_ + auVar138._8_4_ * 0.8571429;
    fStack_3a4 = auVar238._12_4_ + auVar138._12_4_;
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar83 * 4);
  } while( true );
LAB_00f680f9:
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar110._4_4_ = uVar9;
  auVar110._0_4_ = uVar9;
  auVar110._8_4_ = uVar9;
  auVar110._12_4_ = uVar9;
  auVar264 = vcmpps_avx(local_480,auVar110,2);
  uVar88 = vmovmskps_avx(auVar264);
  uVar82 = uVar82 - 1 & uVar82 & uVar88;
  if (uVar82 == 0) {
    return;
  }
  goto LAB_00f65324;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }